

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  RTCFilterFunctionN p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  byte bVar59;
  byte bVar60;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar61;
  byte bVar62;
  ulong uVar63;
  byte bVar64;
  Geometry *pGVar65;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined8 in_R11;
  bool bVar66;
  undefined1 uVar67;
  undefined1 uVar68;
  ulong uVar69;
  uint uVar70;
  uint uVar126;
  uint uVar127;
  uint uVar129;
  uint uVar130;
  uint uVar131;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  uint uVar128;
  uint uVar132;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar79 [16];
  undefined1 auVar123 [32];
  undefined1 auVar125 [32];
  float pp;
  float fVar133;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  float fVar146;
  undefined4 uVar147;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar148;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  undefined1 auVar158 [32];
  undefined1 auVar149 [16];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar204 [16];
  undefined1 auVar207 [32];
  undefined1 auVar205 [16];
  undefined1 auVar208 [32];
  undefined1 auVar206 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [16];
  undefined1 auVar214 [32];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  undefined1 auVar220 [64];
  undefined1 auVar221 [32];
  undefined4 uVar223;
  undefined4 uVar224;
  undefined1 auVar222 [64];
  undefined4 uVar225;
  undefined1 auVar226 [28];
  undefined1 auVar227 [64];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [32];
  float fVar234;
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a14;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_8c0 [16];
  uint local_8b0;
  uint local_8ac;
  float local_8a8;
  float local_8a4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  Primitive *local_808;
  ulong local_800;
  ulong local_7f8;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  RTCHitN local_4a0 [16];
  undefined1 auStack_490 [16];
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  float local_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [16];
  undefined8 local_450;
  undefined8 uStack_448;
  undefined1 local_440 [16];
  uint local_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  uint uStack_420;
  uint uStack_41c;
  uint uStack_418;
  uint uStack_414;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar124 [32];
  
  uVar69 = (ulong)(byte)prim[1];
  fVar234 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar73 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar10 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar79 = vsubps_avx(auVar73,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar189 = fVar234 * auVar79._0_4_;
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar85 = vpmovsxbd_avx2(auVar73);
  fVar133 = fVar234 * auVar10._0_4_;
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar83 = vpmovsxbd_avx2(auVar74);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar71);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar87 = vpmovsxbd_avx2(auVar75);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar88 = vpmovsxbd_avx2(auVar77);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar84 = vpmovsxbd_avx2(auVar76);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar89 = vpmovsxbd_avx2(auVar78);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar90 = vpmovsxbd_avx2(auVar72);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar92 = vpmovsxbd_avx2(auVar237);
  auVar91 = vcvtdq2ps_avx(auVar92);
  auVar103._8_4_ = 1;
  auVar103._0_8_ = 0x100000001;
  auVar103._12_4_ = 1;
  auVar103._16_4_ = 1;
  auVar103._20_4_ = 1;
  auVar103._24_4_ = 1;
  auVar103._28_4_ = 1;
  auVar101._4_4_ = fVar133;
  auVar101._0_4_ = fVar133;
  auVar101._8_4_ = fVar133;
  auVar101._12_4_ = fVar133;
  auVar101._16_4_ = fVar133;
  auVar101._20_4_ = fVar133;
  auVar101._24_4_ = fVar133;
  auVar101._28_4_ = fVar133;
  auVar82 = ZEXT1632(CONCAT412(fVar234 * auVar10._12_4_,
                               CONCAT48(fVar234 * auVar10._8_4_,
                                        CONCAT44(fVar234 * auVar10._4_4_,fVar133))));
  auVar93 = vpermps_avx2(auVar103,auVar82);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar81 = vpermps_avx512vl(auVar80,auVar82);
  fVar133 = auVar81._0_4_;
  auVar210._0_4_ = fVar133 * auVar86._0_4_;
  fVar146 = auVar81._4_4_;
  auVar210._4_4_ = fVar146 * auVar86._4_4_;
  fVar162 = auVar81._8_4_;
  auVar210._8_4_ = fVar162 * auVar86._8_4_;
  fVar163 = auVar81._12_4_;
  auVar210._12_4_ = fVar163 * auVar86._12_4_;
  fVar164 = auVar81._16_4_;
  auVar210._16_4_ = fVar164 * auVar86._16_4_;
  fVar166 = auVar81._20_4_;
  auVar210._20_4_ = fVar166 * auVar86._20_4_;
  fVar165 = auVar81._24_4_;
  auVar210._28_36_ = in_ZMM4._28_36_;
  auVar210._24_4_ = fVar165 * auVar86._24_4_;
  auVar82._4_4_ = auVar84._4_4_ * fVar146;
  auVar82._0_4_ = auVar84._0_4_ * fVar133;
  auVar82._8_4_ = auVar84._8_4_ * fVar162;
  auVar82._12_4_ = auVar84._12_4_ * fVar163;
  auVar82._16_4_ = auVar84._16_4_ * fVar164;
  auVar82._20_4_ = auVar84._20_4_ * fVar166;
  auVar82._24_4_ = auVar84._24_4_ * fVar165;
  auVar82._28_4_ = auVar92._28_4_;
  auVar92._4_4_ = fVar146 * auVar91._4_4_;
  auVar92._0_4_ = fVar133 * auVar91._0_4_;
  auVar92._8_4_ = fVar162 * auVar91._8_4_;
  auVar92._12_4_ = fVar163 * auVar91._12_4_;
  auVar92._16_4_ = fVar164 * auVar91._16_4_;
  auVar92._20_4_ = fVar166 * auVar91._20_4_;
  auVar92._24_4_ = fVar165 * auVar91._24_4_;
  auVar92._28_4_ = auVar81._28_4_;
  auVar73 = vfmadd231ps_fma(auVar210._0_32_,auVar93,auVar83);
  auVar74 = vfmadd231ps_fma(auVar82,auVar93,auVar88);
  auVar71 = vfmadd231ps_fma(auVar92,auVar90,auVar93);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar101,auVar85);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar101,auVar87);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar89,auVar101);
  auVar102._4_4_ = fVar189;
  auVar102._0_4_ = fVar189;
  auVar102._8_4_ = fVar189;
  auVar102._12_4_ = fVar189;
  auVar102._16_4_ = fVar189;
  auVar102._20_4_ = fVar189;
  auVar102._24_4_ = fVar189;
  auVar102._28_4_ = fVar189;
  auVar93 = ZEXT1632(CONCAT412(fVar234 * auVar79._12_4_,
                               CONCAT48(fVar234 * auVar79._8_4_,
                                        CONCAT44(fVar234 * auVar79._4_4_,fVar189))));
  auVar92 = vpermps_avx2(auVar103,auVar93);
  auVar82 = vpermps_avx512vl(auVar80,auVar93);
  fVar234 = auVar82._0_4_;
  fVar133 = auVar82._4_4_;
  auVar93._4_4_ = fVar133 * auVar86._4_4_;
  auVar93._0_4_ = fVar234 * auVar86._0_4_;
  fVar146 = auVar82._8_4_;
  auVar93._8_4_ = fVar146 * auVar86._8_4_;
  fVar162 = auVar82._12_4_;
  auVar93._12_4_ = fVar162 * auVar86._12_4_;
  fVar163 = auVar82._16_4_;
  auVar93._16_4_ = fVar163 * auVar86._16_4_;
  fVar164 = auVar82._20_4_;
  auVar93._20_4_ = fVar164 * auVar86._20_4_;
  fVar166 = auVar82._24_4_;
  auVar93._24_4_ = fVar166 * auVar86._24_4_;
  auVar93._28_4_ = auVar86._28_4_;
  auVar96._0_4_ = fVar234 * auVar84._0_4_;
  auVar96._4_4_ = fVar133 * auVar84._4_4_;
  auVar96._8_4_ = fVar146 * auVar84._8_4_;
  auVar96._12_4_ = fVar162 * auVar84._12_4_;
  auVar96._16_4_ = fVar163 * auVar84._16_4_;
  auVar96._20_4_ = fVar164 * auVar84._20_4_;
  auVar96._24_4_ = fVar166 * auVar84._24_4_;
  auVar96._28_4_ = 0;
  auVar84._4_4_ = fVar133 * auVar91._4_4_;
  auVar84._0_4_ = fVar234 * auVar91._0_4_;
  auVar84._8_4_ = fVar146 * auVar91._8_4_;
  auVar84._12_4_ = fVar162 * auVar91._12_4_;
  auVar84._16_4_ = fVar163 * auVar91._16_4_;
  auVar84._20_4_ = fVar164 * auVar91._20_4_;
  auVar84._24_4_ = fVar166 * auVar91._24_4_;
  auVar84._28_4_ = auVar91._28_4_;
  auVar75 = vfmadd231ps_fma(auVar93,auVar92,auVar83);
  auVar77 = vfmadd231ps_fma(auVar96,auVar92,auVar88);
  auVar76 = vfmadd231ps_fma(auVar84,auVar92,auVar90);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar102,auVar85);
  auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar102,auVar87);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar102,auVar89);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar98._16_4_ = 0x7fffffff;
  auVar98._20_4_ = 0x7fffffff;
  auVar98._24_4_ = 0x7fffffff;
  auVar98._28_4_ = 0x7fffffff;
  auVar100._8_4_ = 0x219392ef;
  auVar100._0_8_ = 0x219392ef219392ef;
  auVar100._12_4_ = 0x219392ef;
  auVar100._16_4_ = 0x219392ef;
  auVar100._20_4_ = 0x219392ef;
  auVar100._24_4_ = 0x219392ef;
  auVar100._28_4_ = 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar73),auVar98);
  uVar61 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar66 = (bool)((byte)uVar61 & 1);
  auVar80._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._0_4_;
  bVar66 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar80._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._4_4_;
  bVar66 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar80._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._8_4_;
  bVar66 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar80._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar73._12_4_;
  auVar80._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar80._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar80._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar80._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar74),auVar98);
  uVar61 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar66 = (bool)((byte)uVar61 & 1);
  auVar81._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar74._0_4_;
  bVar66 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar74._4_4_;
  bVar66 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar74._8_4_;
  bVar66 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar74._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar85 = vandps_avx(ZEXT1632(auVar71),auVar98);
  uVar61 = vcmpps_avx512vl(auVar85,auVar100,1);
  bVar66 = (bool)((byte)uVar61 & 1);
  auVar85._0_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._0_4_;
  bVar66 = (bool)((byte)(uVar61 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._4_4_;
  bVar66 = (bool)((byte)(uVar61 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._8_4_;
  bVar66 = (bool)((byte)(uVar61 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar66 * 0x219392ef | (uint)!bVar66 * auVar71._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar61 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar61 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar61 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar61 >> 7) * 0x219392ef;
  auVar83 = vrcp14ps_avx512vl(auVar80);
  auVar99._8_4_ = 0x3f800000;
  auVar99._0_8_ = 0x3f8000003f800000;
  auVar99._12_4_ = 0x3f800000;
  auVar99._16_4_ = 0x3f800000;
  auVar99._20_4_ = 0x3f800000;
  auVar99._24_4_ = 0x3f800000;
  auVar99._28_4_ = 0x3f800000;
  auVar73 = vfnmadd213ps_fma(auVar80,auVar83,auVar99);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar81);
  auVar74 = vfnmadd213ps_fma(auVar81,auVar83,auVar99);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar83,auVar83);
  auVar83 = vrcp14ps_avx512vl(auVar85);
  auVar71 = vfnmadd213ps_fma(auVar85,auVar83,auVar99);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar83,auVar83);
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar75));
  auVar89._4_4_ = auVar73._4_4_ * auVar85._4_4_;
  auVar89._0_4_ = auVar73._0_4_ * auVar85._0_4_;
  auVar89._8_4_ = auVar73._8_4_ * auVar85._8_4_;
  auVar89._12_4_ = auVar73._12_4_ * auVar85._12_4_;
  auVar89._16_4_ = auVar85._16_4_ * 0.0;
  auVar89._20_4_ = auVar85._20_4_ * 0.0;
  auVar89._24_4_ = auVar85._24_4_ * 0.0;
  auVar89._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar75));
  auVar97._0_4_ = auVar73._0_4_ * auVar85._0_4_;
  auVar97._4_4_ = auVar73._4_4_ * auVar85._4_4_;
  auVar97._8_4_ = auVar73._8_4_ * auVar85._8_4_;
  auVar97._12_4_ = auVar73._12_4_ * auVar85._12_4_;
  auVar97._16_4_ = auVar85._16_4_ * 0.0;
  auVar97._20_4_ = auVar85._20_4_ * 0.0;
  auVar97._24_4_ = auVar85._24_4_ * 0.0;
  auVar97._28_4_ = 0;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar77));
  auVar90._4_4_ = auVar74._4_4_ * auVar85._4_4_;
  auVar90._0_4_ = auVar74._0_4_ * auVar85._0_4_;
  auVar90._8_4_ = auVar74._8_4_ * auVar85._8_4_;
  auVar90._12_4_ = auVar74._12_4_ * auVar85._12_4_;
  auVar90._16_4_ = auVar85._16_4_ * 0.0;
  auVar90._20_4_ = auVar85._20_4_ * 0.0;
  auVar90._24_4_ = auVar85._24_4_ * 0.0;
  auVar90._28_4_ = auVar85._28_4_;
  auVar84 = vpbroadcastd_avx512vl();
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar77));
  auVar83 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar95._0_4_ = auVar74._0_4_ * auVar85._0_4_;
  auVar95._4_4_ = auVar74._4_4_ * auVar85._4_4_;
  auVar95._8_4_ = auVar74._8_4_ * auVar85._8_4_;
  auVar95._12_4_ = auVar74._12_4_ * auVar85._12_4_;
  auVar95._16_4_ = auVar85._16_4_ * 0.0;
  auVar95._20_4_ = auVar85._20_4_ * 0.0;
  auVar95._24_4_ = auVar85._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar85 = vcvtdq2ps_avx(auVar83);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar76));
  auVar91._4_4_ = auVar85._4_4_ * auVar71._4_4_;
  auVar91._0_4_ = auVar85._0_4_ * auVar71._0_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar71._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar71._12_4_;
  auVar91._16_4_ = auVar85._16_4_ * 0.0;
  auVar91._20_4_ = auVar85._20_4_ * 0.0;
  auVar91._24_4_ = auVar85._24_4_ * 0.0;
  auVar91._28_4_ = auVar85._28_4_;
  auVar85 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar76));
  auVar94._0_4_ = auVar71._0_4_ * auVar85._0_4_;
  auVar94._4_4_ = auVar71._4_4_ * auVar85._4_4_;
  auVar94._8_4_ = auVar71._8_4_ * auVar85._8_4_;
  auVar94._12_4_ = auVar71._12_4_ * auVar85._12_4_;
  auVar94._16_4_ = auVar85._16_4_ * 0.0;
  auVar94._20_4_ = auVar85._20_4_ * 0.0;
  auVar94._24_4_ = auVar85._24_4_ * 0.0;
  auVar94._28_4_ = 0;
  auVar85 = vpminsd_avx2(auVar89,auVar97);
  auVar83 = vpminsd_avx2(auVar90,auVar95);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83 = vpminsd_avx2(auVar91,auVar94);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar86._4_4_ = uVar147;
  auVar86._0_4_ = uVar147;
  auVar86._8_4_ = uVar147;
  auVar86._12_4_ = uVar147;
  auVar86._16_4_ = uVar147;
  auVar86._20_4_ = uVar147;
  auVar86._24_4_ = uVar147;
  auVar86._28_4_ = uVar147;
  auVar83 = vmaxps_avx512vl(auVar83,auVar86);
  auVar85 = vmaxps_avx(auVar85,auVar83);
  auVar83._8_4_ = 0x3f7ffffa;
  auVar83._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar83._12_4_ = 0x3f7ffffa;
  auVar83._16_4_ = 0x3f7ffffa;
  auVar83._20_4_ = 0x3f7ffffa;
  auVar83._24_4_ = 0x3f7ffffa;
  auVar83._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar85,auVar83);
  auVar85 = vpmaxsd_avx2(auVar89,auVar97);
  auVar83 = vpmaxsd_avx2(auVar90,auVar95);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar83 = vpmaxsd_avx2(auVar91,auVar94);
  uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar87._4_4_ = uVar147;
  auVar87._0_4_ = uVar147;
  auVar87._8_4_ = uVar147;
  auVar87._12_4_ = uVar147;
  auVar87._16_4_ = uVar147;
  auVar87._20_4_ = uVar147;
  auVar87._24_4_ = uVar147;
  auVar87._28_4_ = uVar147;
  auVar83 = vminps_avx512vl(auVar83,auVar87);
  auVar85 = vminps_avx(auVar85,auVar83);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar85 = vmulps_avx512vl(auVar85,auVar88);
  uVar12 = vcmpps_avx512vl(local_280,auVar85,2);
  uVar14 = vpcmpgtd_avx512vl(auVar84,_DAT_01fb4ba0);
  local_800 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar14));
  local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_808 = prim;
LAB_01a0b47c:
  if (local_800 == 0) {
LAB_01a0dc5e:
    return local_800 != 0;
  }
  lVar16 = 0;
  for (uVar61 = local_800; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
    lVar16 = lVar16 + 1;
  }
  local_7f8 = (ulong)*(uint *)(prim + 2);
  pGVar65 = (context->scene->geometries).items[local_7f8].ptr;
  lVar1 = *(long *)&pGVar65[1].time_range.upper;
  uVar61 = (ulong)*(uint *)(*(long *)&pGVar65->field_0x58 +
                           (ulong)*(uint *)(prim + lVar16 * 4 + 6) *
                           pGVar65[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar73 = *(undefined1 (*) [16])(lVar1 + (long)pGVar65[1].intersectionFilterN * uVar61);
  auVar74 = *(undefined1 (*) [16])(lVar1 + (long)pGVar65[1].intersectionFilterN * (uVar61 + 1));
  auVar71 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x40)));
  local_3e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
  auVar71 = vunpcklps_avx512vl(local_3c0._0_16_,local_3e0._0_16_);
  _local_400 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
  auVar237 = local_400._0_16_;
  local_690 = vinsertps_avx512f(auVar71,auVar237,0x28);
  auVar79._8_4_ = 0xbeaaaaab;
  auVar79._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar79._12_4_ = 0xbeaaaaab;
  auVar76 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar65[2].intersectionFilterN +
                              uVar61 * (long)pGVar65[2].pointQueryFunc),auVar73,auVar79);
  auVar77 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar65[2].intersectionFilterN +
                             (long)pGVar65[2].pointQueryFunc * (uVar61 + 1)),auVar74,auVar79);
  auVar204._0_4_ = auVar74._0_4_ + auVar73._0_4_ + auVar76._0_4_ + auVar77._0_4_;
  auVar204._4_4_ = auVar74._4_4_ + auVar73._4_4_ + auVar76._4_4_ + auVar77._4_4_;
  auVar204._8_4_ = auVar74._8_4_ + auVar73._8_4_ + auVar76._8_4_ + auVar77._8_4_;
  auVar204._12_4_ = auVar74._12_4_ + auVar73._12_4_ + auVar76._12_4_ + auVar77._12_4_;
  auVar10._8_4_ = 0x3e800000;
  auVar10._0_8_ = 0x3e8000003e800000;
  auVar10._12_4_ = 0x3e800000;
  auVar71 = vmulps_avx512vl(auVar204,auVar10);
  auVar71 = vsubps_avx(auVar71,auVar75);
  auVar71 = vdpps_avx(auVar71,local_690,0x7f);
  local_4b0 = vpbroadcastd_avx512vl();
  local_6a0 = vdpps_avx(local_690,local_690,0x7f);
  fVar234 = *(float *)(ray + k * 4 + 0x30);
  auVar211._4_12_ = ZEXT812(0) << 0x20;
  auVar211._0_4_ = local_6a0._0_4_;
  auVar72 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar211);
  auVar78 = vfnmadd213ss_fma(auVar72,local_6a0,ZEXT416(0x40000000));
  local_260 = auVar71._0_4_ * auVar72._0_4_ * auVar78._0_4_;
  auVar210 = ZEXT3264(_DAT_01f7b040);
  auVar218._4_4_ = local_260;
  auVar218._0_4_ = local_260;
  auVar218._8_4_ = local_260;
  auVar218._12_4_ = local_260;
  fStack_370 = local_260;
  _local_380 = auVar218;
  fStack_36c = local_260;
  fStack_368 = local_260;
  fStack_364 = local_260;
  auVar71 = vfmadd231ps_fma(auVar75,local_690,auVar218);
  auVar71 = vblendps_avx(auVar71,ZEXT816(0) << 0x40,8);
  auVar73 = vsubps_avx(auVar73,auVar71);
  auVar75 = vsubps_avx(auVar77,auVar71);
  auVar77 = vsubps_avx(auVar76,auVar71);
  auVar74 = vsubps_avx(auVar74,auVar71);
  local_700 = vbroadcastss_avx512vl(auVar73);
  auVar240 = ZEXT3264(local_700);
  auVar105._8_4_ = 1;
  auVar105._0_8_ = 0x100000001;
  auVar105._12_4_ = 1;
  auVar105._16_4_ = 1;
  auVar105._20_4_ = 1;
  auVar105._24_4_ = 1;
  auVar105._28_4_ = 1;
  local_580 = ZEXT1632(auVar73);
  local_720 = vpermps_avx512vl(auVar105,local_580);
  auVar239 = ZEXT3264(local_720);
  auVar106._8_4_ = 2;
  auVar106._0_8_ = 0x200000002;
  auVar106._12_4_ = 2;
  auVar106._16_4_ = 2;
  auVar106._20_4_ = 2;
  auVar106._24_4_ = 2;
  auVar106._28_4_ = 2;
  local_740 = vpermps_avx2(auVar106,local_580);
  auVar232 = ZEXT3264(local_740);
  auVar107._8_4_ = 3;
  auVar107._0_8_ = 0x300000003;
  auVar107._12_4_ = 3;
  auVar107._16_4_ = 3;
  auVar107._20_4_ = 3;
  auVar107._24_4_ = 3;
  auVar107._28_4_ = 3;
  local_760 = vpermps_avx2(auVar107,local_580);
  auVar220 = ZEXT3264(local_760);
  fVar133 = auVar77._0_4_;
  auVar233._4_4_ = fVar133;
  auVar233._0_4_ = fVar133;
  auVar233._8_4_ = fVar133;
  auVar233._12_4_ = fVar133;
  auVar233._16_4_ = fVar133;
  auVar233._20_4_ = fVar133;
  auVar233._24_4_ = fVar133;
  auVar233._28_4_ = fVar133;
  local_5c0 = ZEXT1632(auVar77);
  local_780 = vpermps_avx2(auVar105,local_5c0);
  auVar235 = ZEXT3264(local_780);
  local_7a0 = vpermps_avx512vl(auVar106,local_5c0);
  local_7c0 = vpermps_avx2(auVar107,local_5c0);
  auVar85 = vbroadcastss_avx512vl(auVar75);
  local_5a0 = ZEXT1632(auVar75);
  auVar83 = vpermps_avx512vl(auVar105,local_5a0);
  auVar86 = vpermps_avx512vl(auVar106,local_5a0);
  auVar87 = vpermps_avx512vl(auVar107,local_5a0);
  auVar88 = vbroadcastss_avx512vl(auVar74);
  _local_5e0 = ZEXT1632(auVar74);
  auVar84 = vpermps_avx512vl(auVar105,_local_5e0);
  local_880 = vpermps_avx512vl(auVar106,_local_5e0);
  auVar236 = ZEXT3264(local_880);
  local_8a0 = vpermps_avx512vl(auVar107,_local_5e0);
  auVar238 = ZEXT3264(local_8a0);
  auVar222 = ZEXT3264(local_780);
  auVar73 = vmulss_avx512f(auVar237,auVar237);
  auVar89 = vfmadd231ps_avx512vl(ZEXT1632(auVar73),local_3e0,local_3e0);
  local_240 = vfmadd231ps_avx512vl(auVar89,local_3c0,local_3c0);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar104._8_4_ = 0x7fffffff;
  auVar104._0_8_ = 0x7fffffff7fffffff;
  auVar104._12_4_ = 0x7fffffff;
  auVar104._16_4_ = 0x7fffffff;
  auVar104._20_4_ = 0x7fffffff;
  auVar104._24_4_ = 0x7fffffff;
  auVar104._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar104);
  local_620 = ZEXT416((uint)local_260);
  local_260 = fVar234 - local_260;
  auVar216 = ZEXT3264(local_7c0);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar61 = 0;
  bVar60 = 0;
  local_a14 = 1;
  local_4c0 = vpbroadcastd_avx512vl();
  auVar73 = vsqrtss_avx(local_6a0,local_6a0);
  local_8a4 = auVar73._0_4_;
  auVar73 = vsqrtss_avx(local_6a0,local_6a0);
  local_8a8 = auVar73._0_4_;
  auVar227 = ZEXT3264(local_7a0);
  local_310 = ZEXT816(0x3f80000000000000);
  auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar242 = ZEXT3264(auVar89);
  do {
    auVar73 = vmovshdup_avx(local_310);
    auVar73 = vsubps_avx(auVar73,local_310);
    fVar165 = auVar73._0_4_;
    fVar166 = fVar165 * 0.04761905;
    auVar185._0_4_ = local_310._0_4_;
    auVar185._4_4_ = auVar185._0_4_;
    auVar185._8_4_ = auVar185._0_4_;
    auVar185._12_4_ = auVar185._0_4_;
    auVar185._16_4_ = auVar185._0_4_;
    auVar185._20_4_ = auVar185._0_4_;
    auVar185._24_4_ = auVar185._0_4_;
    auVar185._28_4_ = auVar185._0_4_;
    auVar190._4_4_ = fVar165;
    auVar190._0_4_ = fVar165;
    auVar190._8_4_ = fVar165;
    auVar190._12_4_ = fVar165;
    local_860._16_4_ = fVar165;
    local_860._0_16_ = auVar190;
    local_860._20_4_ = fVar165;
    local_860._24_4_ = fVar165;
    local_860._28_4_ = fVar165;
    auVar73 = vfmadd231ps_fma(auVar185,local_860,auVar210._0_32_);
    auVar241 = auVar242._0_32_;
    auVar89 = vsubps_avx512vl(auVar241,ZEXT1632(auVar73));
    fVar146 = auVar73._0_4_;
    fVar162 = auVar73._4_4_;
    auVar114._4_4_ = fVar133 * fVar162;
    auVar114._0_4_ = fVar133 * fVar146;
    fVar163 = auVar73._8_4_;
    auVar114._8_4_ = fVar133 * fVar163;
    fVar164 = auVar73._12_4_;
    auVar114._12_4_ = fVar133 * fVar164;
    auVar114._16_4_ = fVar133 * 0.0;
    auVar114._20_4_ = fVar133 * 0.0;
    auVar114._24_4_ = fVar133 * 0.0;
    auVar114._28_4_ = auVar185._0_4_;
    auVar34._4_4_ = auVar222._4_4_ * fVar162;
    auVar34._0_4_ = auVar222._0_4_ * fVar146;
    auVar34._8_4_ = auVar222._8_4_ * fVar163;
    auVar34._12_4_ = auVar222._12_4_ * fVar164;
    auVar34._16_4_ = auVar222._16_4_ * 0.0;
    auVar34._20_4_ = auVar222._20_4_ * 0.0;
    auVar34._24_4_ = auVar222._24_4_ * 0.0;
    auVar34._28_4_ = fVar165;
    auVar57._4_4_ = auVar227._4_4_ * fVar162;
    auVar57._0_4_ = auVar227._0_4_ * fVar146;
    auVar57._8_4_ = auVar227._8_4_ * fVar163;
    auVar57._12_4_ = auVar227._12_4_ * fVar164;
    auVar57._16_4_ = auVar227._16_4_ * 0.0;
    auVar57._20_4_ = auVar227._20_4_ * 0.0;
    auVar57._24_4_ = auVar227._24_4_ * 0.0;
    auVar57._28_4_ = fVar133;
    auVar217._0_4_ = auVar216._0_4_ * fVar146;
    auVar217._4_4_ = auVar216._4_4_ * fVar162;
    auVar217._8_4_ = auVar216._8_4_ * fVar163;
    auVar217._12_4_ = auVar216._12_4_ * fVar164;
    auVar217._16_4_ = auVar216._16_4_ * 0.0;
    auVar217._20_4_ = auVar216._20_4_ * 0.0;
    auVar217._28_36_ = auVar216._28_36_;
    auVar217._24_4_ = auVar216._24_4_ * 0.0;
    auVar90 = vfmadd231ps_avx512vl(auVar114,auVar89,auVar240._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar34,auVar89,auVar239._0_32_);
    auVar74 = vfmadd231ps_fma(auVar57,auVar89,auVar232._0_32_);
    auVar71 = vfmadd231ps_fma(auVar217._0_32_,auVar89,auVar220._0_32_);
    auVar92 = vmulps_avx512vl(auVar85,ZEXT1632(auVar73));
    auVar81 = ZEXT1632(auVar73);
    auVar93 = vmulps_avx512vl(auVar83,auVar81);
    auVar82 = vmulps_avx512vl(auVar86,auVar81);
    auVar80 = vmulps_avx512vl(auVar87,auVar81);
    auVar75 = vfmadd231ps_fma(auVar92,auVar89,auVar233);
    auVar77 = vfmadd231ps_fma(auVar93,auVar89,auVar222._0_32_);
    auVar76 = vfmadd231ps_fma(auVar82,auVar89,auVar227._0_32_);
    auVar78 = vfmadd231ps_fma(auVar80,auVar89,auVar216._0_32_);
    auVar92 = vmulps_avx512vl(auVar88,auVar81);
    auVar93 = vmulps_avx512vl(auVar84,auVar81);
    auVar82 = vmulps_avx512vl(auVar236._0_32_,auVar81);
    auVar80 = vmulps_avx512vl(auVar238._0_32_,auVar81);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar89,auVar85);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar89,auVar83);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar89,auVar86);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar89,auVar87);
    auVar216._28_36_ = auVar235._28_36_;
    auVar216._0_28_ =
         ZEXT1628(CONCAT412(fVar164 * auVar75._12_4_,
                            CONCAT48(fVar163 * auVar75._8_4_,
                                     CONCAT44(fVar162 * auVar75._4_4_,fVar146 * auVar75._0_4_))));
    auVar81 = vmulps_avx512vl(auVar81,ZEXT1632(auVar77));
    auVar94 = vmulps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar76));
    auVar95 = vmulps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar78));
    auVar73 = vfmadd231ps_fma(auVar216._0_32_,auVar89,auVar90);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar89,auVar91);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar89,ZEXT1632(auVar74));
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar89,ZEXT1632(auVar71));
    auVar214._0_4_ = auVar92._0_4_ * fVar146;
    auVar214._4_4_ = auVar92._4_4_ * fVar162;
    auVar214._8_4_ = auVar92._8_4_ * fVar163;
    auVar214._12_4_ = auVar92._12_4_ * fVar164;
    auVar214._16_4_ = auVar92._16_4_ * 0.0;
    auVar214._20_4_ = auVar92._20_4_ * 0.0;
    auVar214._24_4_ = auVar92._24_4_ * 0.0;
    auVar214._28_4_ = 0;
    auVar35._4_4_ = auVar93._4_4_ * fVar162;
    auVar35._0_4_ = auVar93._0_4_ * fVar146;
    auVar35._8_4_ = auVar93._8_4_ * fVar163;
    auVar35._12_4_ = auVar93._12_4_ * fVar164;
    auVar35._16_4_ = auVar93._16_4_ * 0.0;
    auVar35._20_4_ = auVar93._20_4_ * 0.0;
    auVar35._24_4_ = auVar93._24_4_ * 0.0;
    auVar35._28_4_ = auVar92._28_4_;
    auVar36._4_4_ = auVar82._4_4_ * fVar162;
    auVar36._0_4_ = auVar82._0_4_ * fVar146;
    auVar36._8_4_ = auVar82._8_4_ * fVar163;
    auVar36._12_4_ = auVar82._12_4_ * fVar164;
    auVar36._16_4_ = auVar82._16_4_ * 0.0;
    auVar36._20_4_ = auVar82._20_4_ * 0.0;
    auVar36._24_4_ = auVar82._24_4_ * 0.0;
    auVar36._28_4_ = auVar93._28_4_;
    auVar37._4_4_ = auVar80._4_4_ * fVar162;
    auVar37._0_4_ = auVar80._0_4_ * fVar146;
    auVar37._8_4_ = auVar80._8_4_ * fVar163;
    auVar37._12_4_ = auVar80._12_4_ * fVar164;
    auVar37._16_4_ = auVar80._16_4_ * 0.0;
    auVar37._20_4_ = auVar80._20_4_ * 0.0;
    auVar37._24_4_ = auVar80._24_4_ * 0.0;
    auVar37._28_4_ = auVar82._28_4_;
    auVar74 = vfmadd231ps_fma(auVar214,auVar89,ZEXT1632(auVar75));
    auVar71 = vfmadd231ps_fma(auVar35,auVar89,ZEXT1632(auVar77));
    auVar75 = vfmadd231ps_fma(auVar36,auVar89,ZEXT1632(auVar76));
    auVar77 = vfmadd231ps_fma(auVar37,auVar89,ZEXT1632(auVar78));
    auVar38._28_4_ = auVar91._28_4_;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(auVar71._12_4_ * fVar164,
                            CONCAT48(auVar71._8_4_ * fVar163,
                                     CONCAT44(auVar71._4_4_ * fVar162,auVar71._0_4_ * fVar146))));
    auVar39._28_4_ = auVar90._28_4_;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(auVar75._12_4_ * fVar164,
                            CONCAT48(auVar75._8_4_ * fVar163,
                                     CONCAT44(auVar75._4_4_ * fVar162,auVar75._0_4_ * fVar146))));
    auVar76 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar164 * auVar74._12_4_,
                                                 CONCAT48(fVar163 * auVar74._8_4_,
                                                          CONCAT44(fVar162 * auVar74._4_4_,
                                                                   fVar146 * auVar74._0_4_)))),
                              auVar89,ZEXT1632(auVar73));
    auVar82 = vfmadd231ps_avx512vl(auVar38,auVar89,auVar81);
    auVar96 = vfmadd231ps_avx512vl(auVar39,auVar89,auVar94);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar77._12_4_ * fVar164,
                                            CONCAT48(auVar77._8_4_ * fVar163,
                                                     CONCAT44(auVar77._4_4_ * fVar162,
                                                              auVar77._0_4_ * fVar146)))),auVar95,
                         auVar89);
    auVar89 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar73));
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar71),auVar81);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar75),auVar94);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar77),auVar95);
    auVar228._0_4_ = fVar166 * auVar89._0_4_ * 3.0;
    auVar228._4_4_ = fVar166 * auVar89._4_4_ * 3.0;
    auVar228._8_4_ = fVar166 * auVar89._8_4_ * 3.0;
    auVar228._12_4_ = fVar166 * auVar89._12_4_ * 3.0;
    auVar228._16_4_ = fVar166 * auVar89._16_4_ * 3.0;
    auVar228._20_4_ = fVar166 * auVar89._20_4_ * 3.0;
    auVar228._24_4_ = fVar166 * auVar89._24_4_ * 3.0;
    auVar228._28_4_ = 0;
    auVar231._0_4_ = fVar166 * auVar91._0_4_ * 3.0;
    auVar231._4_4_ = fVar166 * auVar91._4_4_ * 3.0;
    auVar231._8_4_ = fVar166 * auVar91._8_4_ * 3.0;
    auVar231._12_4_ = fVar166 * auVar91._12_4_ * 3.0;
    auVar231._16_4_ = fVar166 * auVar91._16_4_ * 3.0;
    auVar231._20_4_ = fVar166 * auVar91._20_4_ * 3.0;
    auVar231._24_4_ = fVar166 * auVar91._24_4_ * 3.0;
    auVar231._28_4_ = 0;
    auVar40._4_4_ = fVar166 * auVar92._4_4_ * 3.0;
    auVar40._0_4_ = fVar166 * auVar92._0_4_ * 3.0;
    auVar40._8_4_ = fVar166 * auVar92._8_4_ * 3.0;
    auVar40._12_4_ = fVar166 * auVar92._12_4_ * 3.0;
    auVar40._16_4_ = fVar166 * auVar92._16_4_ * 3.0;
    auVar40._20_4_ = fVar166 * auVar92._20_4_ * 3.0;
    auVar40._24_4_ = fVar166 * auVar92._24_4_ * 3.0;
    auVar40._28_4_ = auVar80._28_4_;
    fVar146 = auVar93._0_4_ * 3.0 * fVar166;
    fVar162 = auVar93._4_4_ * 3.0 * fVar166;
    auVar41._4_4_ = fVar162;
    auVar41._0_4_ = fVar146;
    fVar163 = auVar93._8_4_ * 3.0 * fVar166;
    auVar41._8_4_ = fVar163;
    fVar164 = auVar93._12_4_ * 3.0 * fVar166;
    auVar41._12_4_ = fVar164;
    fVar165 = auVar93._16_4_ * 3.0 * fVar166;
    auVar41._16_4_ = fVar165;
    fVar189 = auVar93._20_4_ * 3.0 * fVar166;
    auVar41._20_4_ = fVar189;
    fVar167 = auVar93._24_4_ * 3.0 * fVar166;
    auVar41._24_4_ = fVar167;
    auVar41._28_4_ = fVar166;
    auVar73 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar73);
    auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar76),_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar81 = vpermt2ps_avx512vl(auVar82,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar91 = ZEXT1632(auVar73);
    auVar94 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,auVar91);
    auVar207._0_4_ = auVar90._0_4_ + fVar146;
    auVar207._4_4_ = auVar90._4_4_ + fVar162;
    auVar207._8_4_ = auVar90._8_4_ + fVar163;
    auVar207._12_4_ = auVar90._12_4_ + fVar164;
    auVar207._16_4_ = auVar90._16_4_ + fVar165;
    auVar207._20_4_ = auVar90._20_4_ + fVar189;
    auVar207._24_4_ = auVar90._24_4_ + fVar167;
    auVar207._28_4_ = auVar90._28_4_ + fVar166;
    auVar89 = vmaxps_avx(auVar90,auVar207);
    auVar95 = vminps_avx512vl(auVar90,auVar207);
    auVar97 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,auVar91);
    auVar98 = vpermt2ps_avx512vl(auVar228,_DAT_01fb9fc0,auVar91);
    auVar99 = vpermt2ps_avx512vl(auVar231,_DAT_01fb9fc0,auVar91);
    auVar114 = ZEXT1632(auVar73);
    auVar100 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar114);
    auVar90 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar114);
    auVar90 = vsubps_avx(auVar97,auVar90);
    auVar91 = vsubps_avx(auVar80,ZEXT1632(auVar76));
    auVar92 = vsubps_avx(auVar81,auVar82);
    auVar93 = vsubps_avx(auVar94,auVar96);
    auVar101 = vmulps_avx512vl(auVar92,auVar40);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar231,auVar93);
    auVar102 = vmulps_avx512vl(auVar93,auVar228);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar40,auVar91);
    auVar103 = vmulps_avx512vl(auVar91,auVar231);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar228,auVar92);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar102 = vmulps_avx512vl(auVar93,auVar93);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar92,auVar92);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar91);
    auVar103 = vrcp14ps_avx512vl(auVar102);
    auVar104 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar241);
    auVar103 = vfmadd132ps_avx512vl(auVar104,auVar103,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar103);
    auVar104 = vmulps_avx512vl(auVar92,auVar100);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar99,auVar93);
    auVar105 = vmulps_avx512vl(auVar93,auVar98);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar100,auVar91);
    auVar106 = vmulps_avx512vl(auVar91,auVar99);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar98,auVar92);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar101 = vmaxps_avx512vl(auVar101,auVar103);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar103 = vmaxps_avx512vl(auVar90,auVar97);
    auVar89 = vmaxps_avx512vl(auVar89,auVar103);
    auVar103 = vaddps_avx512vl(auVar101,auVar89);
    auVar89 = vminps_avx(auVar90,auVar97);
    auVar89 = vminps_avx512vl(auVar95,auVar89);
    auVar89 = vsubps_avx512vl(auVar89,auVar101);
    auVar108._8_4_ = 0x3f800002;
    auVar108._0_8_ = 0x3f8000023f800002;
    auVar108._12_4_ = 0x3f800002;
    auVar108._16_4_ = 0x3f800002;
    auVar108._20_4_ = 0x3f800002;
    auVar108._24_4_ = 0x3f800002;
    auVar108._28_4_ = 0x3f800002;
    auVar90 = vmulps_avx512vl(auVar103,auVar108);
    auVar202._8_4_ = 0x3f7ffffc;
    auVar202._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar202._12_4_ = 0x3f7ffffc;
    auVar202._16_4_ = 0x3f7ffffc;
    auVar202._20_4_ = 0x3f7ffffc;
    auVar202._24_4_ = 0x3f7ffffc;
    auVar202._28_4_ = 0x3f7ffffc;
    local_6e0 = vmulps_avx512vl(auVar89,auVar202);
    auVar89 = vmulps_avx512vl(auVar90,auVar90);
    auVar90 = vrsqrt14ps_avx512vl(auVar102);
    auVar109._8_4_ = 0xbf000000;
    auVar109._0_8_ = 0xbf000000bf000000;
    auVar109._12_4_ = 0xbf000000;
    auVar109._16_4_ = 0xbf000000;
    auVar109._20_4_ = 0xbf000000;
    auVar109._24_4_ = 0xbf000000;
    auVar109._28_4_ = 0xbf000000;
    auVar95 = vmulps_avx512vl(auVar102,auVar109);
    fVar146 = auVar90._0_4_;
    fVar162 = auVar90._4_4_;
    fVar163 = auVar90._8_4_;
    fVar164 = auVar90._12_4_;
    fVar166 = auVar90._16_4_;
    fVar165 = auVar90._20_4_;
    fVar189 = auVar90._24_4_;
    auVar42._4_4_ = fVar162 * fVar162 * fVar162 * auVar95._4_4_;
    auVar42._0_4_ = fVar146 * fVar146 * fVar146 * auVar95._0_4_;
    auVar42._8_4_ = fVar163 * fVar163 * fVar163 * auVar95._8_4_;
    auVar42._12_4_ = fVar164 * fVar164 * fVar164 * auVar95._12_4_;
    auVar42._16_4_ = fVar166 * fVar166 * fVar166 * auVar95._16_4_;
    auVar42._20_4_ = fVar165 * fVar165 * fVar165 * auVar95._20_4_;
    auVar42._24_4_ = fVar189 * fVar189 * fVar189 * auVar95._24_4_;
    auVar42._28_4_ = auVar103._28_4_;
    auVar110._8_4_ = 0x3fc00000;
    auVar110._0_8_ = 0x3fc000003fc00000;
    auVar110._12_4_ = 0x3fc00000;
    auVar110._16_4_ = 0x3fc00000;
    auVar110._20_4_ = 0x3fc00000;
    auVar110._24_4_ = 0x3fc00000;
    auVar110._28_4_ = 0x3fc00000;
    auVar90 = vfmadd231ps_avx512vl(auVar42,auVar90,auVar110);
    auVar235 = ZEXT3264(auVar90);
    auVar95 = vmulps_avx512vl(auVar91,auVar90);
    auVar97 = vmulps_avx512vl(auVar92,auVar90);
    auVar101 = vmulps_avx512vl(auVar93,auVar90);
    auVar202 = ZEXT1632(auVar76);
    auVar102 = vsubps_avx512vl(auVar114,auVar202);
    auVar103 = vsubps_avx512vl(auVar114,auVar82);
    auVar104 = vsubps_avx512vl(auVar114,auVar96);
    auVar105 = vmulps_avx512vl(_local_400,auVar104);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_3e0,auVar103);
    auVar105 = vfmadd231ps_avx512vl(auVar105,local_3c0,auVar102);
    auVar106 = vmulps_avx512vl(auVar104,auVar104);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,auVar103);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar102);
    auVar107 = vmulps_avx512vl(_local_400,auVar101);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar97,local_3e0);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar95,local_3c0);
    auVar101 = vmulps_avx512vl(auVar104,auVar101);
    auVar97 = vfmadd231ps_avx512vl(auVar101,auVar103,auVar97);
    auVar95 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar95);
    auVar97 = vmulps_avx512vl(auVar107,auVar107);
    auVar101 = vsubps_avx512vl(local_220,auVar97);
    auVar108 = vmulps_avx512vl(auVar107,auVar95);
    auVar105 = vsubps_avx512vl(auVar105,auVar108);
    auVar105 = vaddps_avx512vl(auVar105,auVar105);
    auVar108 = vmulps_avx512vl(auVar95,auVar95);
    local_840 = vsubps_avx512vl(auVar106,auVar108);
    auVar89 = vsubps_avx512vl(local_840,auVar89);
    local_6c0 = vmulps_avx512vl(auVar105,auVar105);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    _local_500 = vmulps_avx512vl(auVar101,auVar113);
    auVar106 = vmulps_avx512vl(_local_500,auVar89);
    auVar106 = vsubps_avx512vl(local_6c0,auVar106);
    uVar69 = vcmpps_avx512vl(auVar106,auVar114,5);
    bVar58 = (byte)uVar69;
    if (bVar58 == 0) {
LAB_01a0c10e:
      auVar210 = ZEXT3264(_DAT_01f7b040);
      auVar240 = ZEXT3264(local_700);
      auVar239 = ZEXT3264(local_720);
      auVar232 = ZEXT3264(local_740);
      auVar220 = ZEXT3264(local_760);
      auVar222 = ZEXT3264(local_780);
      auVar227 = ZEXT3264(local_7a0);
      auVar216 = ZEXT3264(local_7c0);
      auVar236 = ZEXT3264(local_880);
      auVar238 = ZEXT3264(local_8a0);
    }
    else {
      auVar106 = vsqrtps_avx512vl(auVar106);
      auVar108 = vaddps_avx512vl(auVar101,auVar101);
      local_680 = vrcp14ps_avx512vl(auVar108);
      in_ZMM31 = ZEXT3264(local_680);
      auVar109 = vfnmadd213ps_avx512vl(local_680,auVar108,auVar241);
      auVar109 = vfmadd132ps_avx512vl(auVar109,local_680,local_680);
      auVar241._8_4_ = 0x80000000;
      auVar241._0_8_ = 0x8000000080000000;
      auVar241._12_4_ = 0x80000000;
      auVar241._16_4_ = 0x80000000;
      auVar241._20_4_ = 0x80000000;
      auVar241._24_4_ = 0x80000000;
      auVar241._28_4_ = 0x80000000;
      local_660 = vxorps_avx512vl(auVar105,auVar241);
      auVar110 = vsubps_avx512vl(local_660,auVar106);
      local_640 = vmulps_avx512vl(auVar110,auVar109);
      auVar106 = vsubps_avx512vl(auVar106,auVar105);
      local_520 = vmulps_avx512vl(auVar106,auVar109);
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar109 = vblendmps_avx512vl(auVar106,local_640);
      auVar111._0_4_ =
           (uint)(bVar58 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar106._0_4_;
      bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar66 * auVar109._4_4_ | (uint)!bVar66 * auVar106._4_4_;
      bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar66 * auVar109._8_4_ | (uint)!bVar66 * auVar106._8_4_;
      bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar66 * auVar109._12_4_ | (uint)!bVar66 * auVar106._12_4_;
      bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar111._16_4_ = (uint)bVar66 * auVar109._16_4_ | (uint)!bVar66 * auVar106._16_4_;
      bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar111._20_4_ = (uint)bVar66 * auVar109._20_4_ | (uint)!bVar66 * auVar106._20_4_;
      bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar111._24_4_ = (uint)bVar66 * auVar109._24_4_ | (uint)!bVar66 * auVar106._24_4_;
      bVar66 = SUB81(uVar69 >> 7,0);
      auVar111._28_4_ = (uint)bVar66 * auVar109._28_4_ | (uint)!bVar66 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar109 = vblendmps_avx512vl(auVar106,local_520);
      auVar112._0_4_ =
           (uint)(bVar58 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar106._0_4_;
      bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar66 * auVar109._4_4_ | (uint)!bVar66 * auVar106._4_4_;
      bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar66 * auVar109._8_4_ | (uint)!bVar66 * auVar106._8_4_;
      bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar66 * auVar109._12_4_ | (uint)!bVar66 * auVar106._12_4_;
      bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar66 * auVar109._16_4_ | (uint)!bVar66 * auVar106._16_4_;
      bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar66 * auVar109._20_4_ | (uint)!bVar66 * auVar106._20_4_;
      bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar66 * auVar109._24_4_ | (uint)!bVar66 * auVar106._24_4_;
      bVar66 = SUB81(uVar69 >> 7,0);
      auVar112._28_4_ = (uint)bVar66 * auVar109._28_4_ | (uint)!bVar66 * auVar106._28_4_;
      auVar106 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar97,auVar106);
      local_540 = vmaxps_avx512vl(local_240,auVar106);
      auVar27._8_4_ = 0x36000000;
      auVar27._0_8_ = 0x3600000036000000;
      auVar27._12_4_ = 0x36000000;
      auVar27._16_4_ = 0x36000000;
      auVar27._20_4_ = 0x36000000;
      auVar27._24_4_ = 0x36000000;
      auVar27._28_4_ = 0x36000000;
      local_560 = vmulps_avx512vl(local_540,auVar27);
      vandps_avx512vl(auVar101,auVar106);
      uVar63 = vcmpps_avx512vl(local_560,local_560,1);
      uVar69 = uVar69 & uVar63;
      bVar64 = (byte)uVar69;
      if (bVar64 != 0) {
        uVar63 = vcmpps_avx512vl(auVar89,_DAT_01f7b000,2);
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar101 = vblendmps_avx512vl(auVar89,auVar97);
        bVar62 = (byte)uVar63;
        uVar70 = (uint)(bVar62 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar62 & 1) * local_560._0_4_;
        bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
        uVar126 = (uint)bVar66 * auVar101._4_4_ | (uint)!bVar66 * local_560._4_4_;
        bVar66 = (bool)((byte)(uVar63 >> 2) & 1);
        uVar127 = (uint)bVar66 * auVar101._8_4_ | (uint)!bVar66 * local_560._8_4_;
        bVar66 = (bool)((byte)(uVar63 >> 3) & 1);
        uVar128 = (uint)bVar66 * auVar101._12_4_ | (uint)!bVar66 * local_560._12_4_;
        bVar66 = (bool)((byte)(uVar63 >> 4) & 1);
        uVar129 = (uint)bVar66 * auVar101._16_4_ | (uint)!bVar66 * local_560._16_4_;
        bVar66 = (bool)((byte)(uVar63 >> 5) & 1);
        uVar130 = (uint)bVar66 * auVar101._20_4_ | (uint)!bVar66 * local_560._20_4_;
        bVar66 = (bool)((byte)(uVar63 >> 6) & 1);
        uVar131 = (uint)bVar66 * auVar101._24_4_ | (uint)!bVar66 * local_560._24_4_;
        bVar66 = SUB81(uVar63 >> 7,0);
        uVar132 = (uint)bVar66 * auVar101._28_4_ | (uint)!bVar66 * local_560._28_4_;
        auVar111._0_4_ = (bVar64 & 1) * uVar70 | !(bool)(bVar64 & 1) * auVar111._0_4_;
        bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar111._4_4_ = bVar66 * uVar126 | !bVar66 * auVar111._4_4_;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar111._8_4_ = bVar66 * uVar127 | !bVar66 * auVar111._8_4_;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar111._12_4_ = bVar66 * uVar128 | !bVar66 * auVar111._12_4_;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar111._16_4_ = bVar66 * uVar129 | !bVar66 * auVar111._16_4_;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar111._20_4_ = bVar66 * uVar130 | !bVar66 * auVar111._20_4_;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar111._24_4_ = bVar66 * uVar131 | !bVar66 * auVar111._24_4_;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar111._28_4_ = bVar66 * uVar132 | !bVar66 * auVar111._28_4_;
        auVar89 = vblendmps_avx512vl(auVar97,auVar89);
        bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar63 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar63 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar63 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar63 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar63 >> 6) & 1);
        bVar9 = SUB81(uVar63 >> 7,0);
        auVar112._0_4_ =
             (uint)(bVar64 & 1) *
             ((uint)(bVar62 & 1) * auVar89._0_4_ | !(bool)(bVar62 & 1) * uVar70) |
             !(bool)(bVar64 & 1) * auVar112._0_4_;
        bVar3 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar112._4_4_ =
             (uint)bVar3 * ((uint)bVar66 * auVar89._4_4_ | !bVar66 * uVar126) |
             !bVar3 * auVar112._4_4_;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar112._8_4_ =
             (uint)bVar66 * ((uint)bVar4 * auVar89._8_4_ | !bVar4 * uVar127) |
             !bVar66 * auVar112._8_4_;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar112._12_4_ =
             (uint)bVar66 * ((uint)bVar5 * auVar89._12_4_ | !bVar5 * uVar128) |
             !bVar66 * auVar112._12_4_;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar112._16_4_ =
             (uint)bVar66 * ((uint)bVar6 * auVar89._16_4_ | !bVar6 * uVar129) |
             !bVar66 * auVar112._16_4_;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar112._20_4_ =
             (uint)bVar66 * ((uint)bVar7 * auVar89._20_4_ | !bVar7 * uVar130) |
             !bVar66 * auVar112._20_4_;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar112._24_4_ =
             (uint)bVar66 * ((uint)bVar8 * auVar89._24_4_ | !bVar8 * uVar131) |
             !bVar66 * auVar112._24_4_;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar112._28_4_ =
             (uint)bVar66 * ((uint)bVar9 * auVar89._28_4_ | !bVar9 * uVar132) |
             !bVar66 * auVar112._28_4_;
        bVar58 = (~bVar64 | bVar62) & bVar58;
      }
      if ((bVar58 & 0x7f) == 0) {
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar242 = ZEXT3264(auVar89);
        goto LAB_01a0c10e;
      }
      auVar89 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar97 = vxorps_avx512vl(auVar100,auVar89);
      auVar98 = vxorps_avx512vl(auVar98,auVar89);
      auVar210 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
      auVar99 = vxorps_avx512vl(auVar99,auVar89);
      auVar73 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),ZEXT416((uint)local_620._0_4_)
                              );
      auVar100 = vbroadcastss_avx512vl(auVar73);
      auVar100 = vminps_avx512vl(auVar100,auVar112);
      auVar56._4_4_ = fStack_25c;
      auVar56._0_4_ = local_260;
      auVar56._8_4_ = fStack_258;
      auVar56._12_4_ = fStack_254;
      auVar56._16_4_ = fStack_250;
      auVar56._20_4_ = fStack_24c;
      auVar56._24_4_ = fStack_248;
      auVar56._28_4_ = fStack_244;
      auVar101 = vmaxps_avx512vl(auVar56,auVar111);
      auVar104 = vmulps_avx512vl(auVar104,auVar40);
      auVar103 = vfmadd213ps_avx512vl(auVar103,auVar231,auVar104);
      auVar73 = vfmadd213ps_fma(auVar102,auVar228,auVar103);
      in_ZMM31 = ZEXT3264(_local_400);
      auVar102 = vmulps_avx512vl(_local_400,auVar40);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_3e0,auVar231);
      auVar102 = vfmadd231ps_avx512vl(auVar102,local_3c0,auVar228);
      auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar102,auVar103);
      auVar104 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar12 = vcmpps_avx512vl(auVar103,auVar104,1);
      auVar106 = vxorps_avx512vl(ZEXT1632(auVar73),auVar89);
      auVar109 = vrcp14ps_avx512vl(auVar102);
      auVar110 = vxorps_avx512vl(auVar102,auVar89);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar114 = vfnmadd213ps_avx512vl(auVar109,auVar102,auVar113);
      auVar73 = vfmadd132ps_fma(auVar114,auVar109,auVar109);
      fVar146 = auVar73._0_4_ * auVar106._0_4_;
      fVar162 = auVar73._4_4_ * auVar106._4_4_;
      auVar43._4_4_ = fVar162;
      auVar43._0_4_ = fVar146;
      fVar163 = auVar73._8_4_ * auVar106._8_4_;
      auVar43._8_4_ = fVar163;
      fVar164 = auVar73._12_4_ * auVar106._12_4_;
      auVar43._12_4_ = fVar164;
      fVar166 = auVar106._16_4_ * 0.0;
      auVar43._16_4_ = fVar166;
      fVar165 = auVar106._20_4_ * 0.0;
      auVar43._20_4_ = fVar165;
      fVar189 = auVar106._24_4_ * 0.0;
      auVar43._24_4_ = fVar189;
      auVar43._28_4_ = auVar106._28_4_;
      uVar14 = vcmpps_avx512vl(auVar102,auVar110,1);
      bVar64 = (byte)uVar12 | (byte)uVar14;
      auVar229._8_4_ = 0xff800000;
      auVar229._0_8_ = 0xff800000ff800000;
      auVar229._12_4_ = 0xff800000;
      auVar229._16_4_ = 0xff800000;
      auVar229._20_4_ = 0xff800000;
      auVar229._24_4_ = 0xff800000;
      auVar229._28_4_ = 0xff800000;
      auVar109 = vblendmps_avx512vl(auVar43,auVar229);
      auVar115._0_4_ = (uint)(bVar64 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar64 & 1) * -0x800000;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar115._4_4_ = (uint)bVar66 * auVar109._4_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar115._8_4_ = (uint)bVar66 * auVar109._8_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar115._12_4_ = (uint)bVar66 * auVar109._12_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar115._16_4_ = (uint)bVar66 * auVar109._16_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar115._20_4_ = (uint)bVar66 * auVar109._20_4_ | (uint)!bVar66 * -0x800000;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar115._24_4_ = (uint)bVar66 * auVar109._24_4_ | (uint)!bVar66 * -0x800000;
      auVar115._28_4_ =
           (uint)(bVar64 >> 7) * auVar109._28_4_ | (uint)!(bool)(bVar64 >> 7) * -0x800000;
      auVar109 = vmaxps_avx512vl(auVar101,auVar115);
      uVar14 = vcmpps_avx512vl(auVar102,auVar110,6);
      bVar64 = (byte)uVar12 | (byte)uVar14;
      auVar116._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar146;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar162;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar163;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar164;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar166;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar165;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar189;
      auVar116._28_4_ =
           (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar106._28_4_;
      auVar100 = vminps_avx512vl(auVar100,auVar116);
      auVar73 = vxorps_avx512vl(auVar101._0_16_,auVar101._0_16_);
      auVar80 = vsubps_avx512vl(ZEXT1632(auVar73),auVar80);
      auVar81 = vsubps_avx512vl(ZEXT1632(auVar73),auVar81);
      auVar101 = ZEXT1632(auVar73);
      auVar94 = vsubps_avx512vl(auVar101,auVar94);
      auVar94 = vmulps_avx512vl(auVar94,auVar97);
      auVar81 = vfmadd231ps_avx512vl(auVar94,auVar99,auVar81);
      auVar80 = vfmadd231ps_avx512vl(auVar81,auVar98,auVar80);
      auVar81 = vmulps_avx512vl(_local_400,auVar97);
      auVar81 = vfmadd231ps_avx512vl(auVar81,local_3e0,auVar99);
      auVar81 = vfmadd231ps_avx512vl(auVar81,local_3c0,auVar98);
      vandps_avx512vl(auVar81,auVar103);
      uVar12 = vcmpps_avx512vl(auVar81,auVar104,1);
      auVar80 = vxorps_avx512vl(auVar80,auVar89);
      auVar94 = vrcp14ps_avx512vl(auVar81);
      auVar89 = vxorps_avx512vl(auVar81,auVar89);
      auVar97 = vfnmadd213ps_avx512vl(auVar94,auVar81,auVar113);
      auVar73 = vfmadd132ps_fma(auVar97,auVar94,auVar94);
      fVar146 = auVar73._0_4_ * auVar80._0_4_;
      fVar162 = auVar73._4_4_ * auVar80._4_4_;
      auVar44._4_4_ = fVar162;
      auVar44._0_4_ = fVar146;
      fVar163 = auVar73._8_4_ * auVar80._8_4_;
      auVar44._8_4_ = fVar163;
      fVar164 = auVar73._12_4_ * auVar80._12_4_;
      auVar44._12_4_ = fVar164;
      fVar166 = auVar80._16_4_ * 0.0;
      auVar44._16_4_ = fVar166;
      fVar165 = auVar80._20_4_ * 0.0;
      auVar44._20_4_ = fVar165;
      fVar189 = auVar80._24_4_ * 0.0;
      auVar44._24_4_ = fVar189;
      auVar44._28_4_ = auVar80._28_4_;
      uVar14 = vcmpps_avx512vl(auVar81,auVar89,1);
      bVar64 = (byte)uVar12 | (byte)uVar14;
      auVar28._8_4_ = 0xff800000;
      auVar28._0_8_ = 0xff800000ff800000;
      auVar28._12_4_ = 0xff800000;
      auVar28._16_4_ = 0xff800000;
      auVar28._20_4_ = 0xff800000;
      auVar28._24_4_ = 0xff800000;
      auVar28._28_4_ = 0xff800000;
      auVar97 = vblendmps_avx512vl(auVar44,auVar28);
      auVar117._0_4_ =
           (uint)(bVar64 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar94._0_4_;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar66 * auVar97._4_4_ | (uint)!bVar66 * auVar94._4_4_;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar66 * auVar97._8_4_ | (uint)!bVar66 * auVar94._8_4_;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar66 * auVar97._12_4_ | (uint)!bVar66 * auVar94._12_4_;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar66 * auVar97._16_4_ | (uint)!bVar66 * auVar94._16_4_;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar66 * auVar97._20_4_ | (uint)!bVar66 * auVar94._20_4_;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar66 * auVar97._24_4_ | (uint)!bVar66 * auVar94._24_4_;
      auVar117._28_4_ =
           (uint)(bVar64 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar64 >> 7) * auVar94._28_4_;
      local_3a0 = vmaxps_avx(auVar109,auVar117);
      uVar14 = vcmpps_avx512vl(auVar81,auVar89,6);
      bVar64 = (byte)uVar12 | (byte)uVar14;
      auVar118._0_4_ = (uint)(bVar64 & 1) * 0x7f800000 | (uint)!(bool)(bVar64 & 1) * (int)fVar146;
      bVar66 = (bool)(bVar64 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar162;
      bVar66 = (bool)(bVar64 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar163;
      bVar66 = (bool)(bVar64 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar164;
      bVar66 = (bool)(bVar64 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar166;
      bVar66 = (bool)(bVar64 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar165;
      bVar66 = (bool)(bVar64 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar66 * 0x7f800000 | (uint)!bVar66 * (int)fVar189;
      auVar118._28_4_ =
           (uint)(bVar64 >> 7) * 0x7f800000 | (uint)!(bool)(bVar64 >> 7) * auVar80._28_4_;
      local_2c0 = vminps_avx(auVar100,auVar118);
      uVar12 = vcmpps_avx512vl(local_3a0,local_2c0,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar12;
      if (bVar58 == 0) {
        auVar242 = ZEXT3264(auVar113);
        goto LAB_01a0c10e;
      }
      auVar80 = vmaxps_avx512vl(auVar101,local_6e0);
      auVar89 = vfmadd213ps_avx512vl(local_640,auVar107,auVar95);
      fVar146 = auVar90._0_4_;
      fVar162 = auVar90._4_4_;
      auVar45._4_4_ = fVar162 * auVar89._4_4_;
      auVar45._0_4_ = fVar146 * auVar89._0_4_;
      fVar163 = auVar90._8_4_;
      auVar45._8_4_ = fVar163 * auVar89._8_4_;
      fVar164 = auVar90._12_4_;
      auVar45._12_4_ = fVar164 * auVar89._12_4_;
      fVar166 = auVar90._16_4_;
      auVar45._16_4_ = fVar166 * auVar89._16_4_;
      fVar165 = auVar90._20_4_;
      auVar45._20_4_ = fVar165 * auVar89._20_4_;
      fVar189 = auVar90._24_4_;
      auVar45._24_4_ = fVar189 * auVar89._24_4_;
      auVar45._28_4_ = auVar89._28_4_;
      auVar89 = vfmadd213ps_avx512vl(local_520,auVar107,auVar95);
      auVar46._4_4_ = fVar162 * auVar89._4_4_;
      auVar46._0_4_ = fVar146 * auVar89._0_4_;
      auVar46._8_4_ = fVar163 * auVar89._8_4_;
      auVar46._12_4_ = fVar164 * auVar89._12_4_;
      auVar46._16_4_ = fVar166 * auVar89._16_4_;
      auVar46._20_4_ = fVar165 * auVar89._20_4_;
      auVar46._24_4_ = fVar189 * auVar89._24_4_;
      auVar46._28_4_ = auVar89._28_4_;
      auVar89 = vminps_avx512vl(auVar45,auVar113);
      auVar53 = ZEXT812(0);
      auVar81 = ZEXT1232(auVar53) << 0x20;
      auVar89 = vmaxps_avx(auVar89,ZEXT1232(auVar53) << 0x20);
      auVar94 = vminps_avx512vl(auVar46,auVar113);
      auVar47._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar89._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar47,local_860,auVar185);
      auVar89 = vmaxps_avx(auVar94,ZEXT1232(auVar53) << 0x20);
      auVar48._4_4_ = (auVar89._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar89._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar89._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar89._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar89._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar89._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar89._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar89._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar48,local_860,auVar185);
      auVar49._4_4_ = auVar80._4_4_ * auVar80._4_4_;
      auVar49._0_4_ = auVar80._0_4_ * auVar80._0_4_;
      auVar49._8_4_ = auVar80._8_4_ * auVar80._8_4_;
      auVar49._12_4_ = auVar80._12_4_ * auVar80._12_4_;
      auVar49._16_4_ = auVar80._16_4_ * auVar80._16_4_;
      auVar49._20_4_ = auVar80._20_4_ * auVar80._20_4_;
      auVar49._24_4_ = auVar80._24_4_ * auVar80._24_4_;
      auVar49._28_4_ = auVar80._28_4_;
      auVar89 = vsubps_avx(local_840,auVar49);
      auVar50._4_4_ = auVar89._4_4_ * (float)local_500._4_4_;
      auVar50._0_4_ = auVar89._0_4_ * (float)local_500._0_4_;
      auVar50._8_4_ = auVar89._8_4_ * fStack_4f8;
      auVar50._12_4_ = auVar89._12_4_ * fStack_4f4;
      auVar50._16_4_ = auVar89._16_4_ * fStack_4f0;
      auVar50._20_4_ = auVar89._20_4_ * fStack_4ec;
      auVar50._24_4_ = auVar89._24_4_ * fStack_4e8;
      auVar50._28_4_ = auVar80._28_4_;
      auVar80 = vsubps_avx(local_6c0,auVar50);
      uVar12 = vcmpps_avx512vl(auVar80,ZEXT1232(auVar53) << 0x20,5);
      bVar64 = (byte)uVar12;
      auVar236 = ZEXT3264(local_880);
      auVar238 = ZEXT3264(local_8a0);
      if (bVar64 == 0) {
        bVar64 = 0;
        auVar90 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar216 = ZEXT864(0) << 0x20;
        auVar80 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar94 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar226 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar119._8_4_ = 0x7f800000;
        auVar119._0_8_ = 0x7f8000007f800000;
        auVar119._12_4_ = 0x7f800000;
        auVar119._16_4_ = 0x7f800000;
        auVar119._20_4_ = 0x7f800000;
        auVar119._24_4_ = 0x7f800000;
        auVar119._28_4_ = 0x7f800000;
        auVar120._8_4_ = 0xff800000;
        auVar120._0_8_ = 0xff800000ff800000;
        auVar120._12_4_ = 0xff800000;
        auVar120._16_4_ = 0xff800000;
        auVar120._20_4_ = 0xff800000;
        auVar120._24_4_ = 0xff800000;
        auVar120._28_4_ = 0xff800000;
      }
      else {
        auVar74 = vxorps_avx512vl(auVar190,auVar190);
        uVar69 = vcmpps_avx512vl(auVar80,auVar101,5);
        auVar80 = vsqrtps_avx(auVar80);
        auVar81 = vfnmadd213ps_avx512vl(auVar108,local_680,auVar113);
        auVar97 = vfmadd132ps_avx512vl(auVar81,local_680,local_680);
        auVar81 = vsubps_avx(local_660,auVar80);
        auVar98 = vmulps_avx512vl(auVar81,auVar97);
        auVar80 = vsubps_avx512vl(auVar80,auVar105);
        auVar97 = vmulps_avx512vl(auVar80,auVar97);
        auVar80 = vfmadd213ps_avx512vl(auVar107,auVar98,auVar95);
        auVar51._4_4_ = fVar162 * auVar80._4_4_;
        auVar51._0_4_ = fVar146 * auVar80._0_4_;
        auVar51._8_4_ = fVar163 * auVar80._8_4_;
        auVar51._12_4_ = fVar164 * auVar80._12_4_;
        auVar51._16_4_ = fVar166 * auVar80._16_4_;
        auVar51._20_4_ = fVar165 * auVar80._20_4_;
        auVar51._24_4_ = fVar189 * auVar80._24_4_;
        auVar51._28_4_ = auVar94._28_4_;
        auVar80 = vmulps_avx512vl(local_3c0,auVar98);
        auVar81 = vmulps_avx512vl(local_3e0,auVar98);
        auVar99 = vmulps_avx512vl(_local_400,auVar98);
        auVar94 = vfmadd213ps_avx512vl(auVar91,auVar51,auVar202);
        auVar80 = vsubps_avx512vl(auVar80,auVar94);
        auVar94 = vfmadd213ps_avx512vl(auVar92,auVar51,auVar82);
        auVar94 = vsubps_avx512vl(auVar81,auVar94);
        auVar73 = vfmadd213ps_fma(auVar51,auVar93,auVar96);
        auVar81 = vsubps_avx(auVar99,ZEXT1632(auVar73));
        auVar226 = auVar81._0_28_;
        auVar81 = vfmadd213ps_avx512vl(auVar107,auVar97,auVar95);
        auVar95 = vmulps_avx512vl(auVar90,auVar81);
        auVar235 = ZEXT3264(auVar95);
        auVar90 = vmulps_avx512vl(local_3c0,auVar97);
        auVar99 = vmulps_avx512vl(local_3e0,auVar97);
        auVar100 = vmulps_avx512vl(_local_400,auVar97);
        auVar73 = vfmadd213ps_fma(auVar91,auVar95,auVar202);
        auVar81 = vsubps_avx(auVar90,ZEXT1632(auVar73));
        auVar73 = vfmadd213ps_fma(auVar92,auVar95,auVar82);
        auVar90 = vsubps_avx512vl(auVar99,ZEXT1632(auVar73));
        auVar73 = vfmadd213ps_fma(auVar93,auVar95,auVar96);
        auVar91 = vsubps_avx512vl(auVar100,ZEXT1632(auVar73));
        auVar216 = ZEXT3264(auVar91);
        auVar186._8_4_ = 0x7f800000;
        auVar186._0_8_ = 0x7f8000007f800000;
        auVar186._12_4_ = 0x7f800000;
        auVar186._16_4_ = 0x7f800000;
        auVar186._20_4_ = 0x7f800000;
        auVar186._24_4_ = 0x7f800000;
        auVar186._28_4_ = 0x7f800000;
        auVar91 = vblendmps_avx512vl(auVar186,auVar98);
        bVar66 = (bool)((byte)uVar69 & 1);
        auVar119._0_4_ = (uint)bVar66 * auVar91._0_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar119._4_4_ = (uint)bVar66 * auVar91._4_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar119._8_4_ = (uint)bVar66 * auVar91._8_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar119._12_4_ = (uint)bVar66 * auVar91._12_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar119._16_4_ = (uint)bVar66 * auVar91._16_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar119._20_4_ = (uint)bVar66 * auVar91._20_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar119._24_4_ = (uint)bVar66 * auVar91._24_4_ | (uint)!bVar66 * 0x7f800000;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar119._28_4_ = (uint)bVar66 * auVar91._28_4_ | (uint)!bVar66 * 0x7f800000;
        auVar203._8_4_ = 0xff800000;
        auVar203._0_8_ = 0xff800000ff800000;
        auVar203._12_4_ = 0xff800000;
        auVar203._16_4_ = 0xff800000;
        auVar203._20_4_ = 0xff800000;
        auVar203._24_4_ = 0xff800000;
        auVar203._28_4_ = 0xff800000;
        auVar91 = vblendmps_avx512vl(auVar203,auVar97);
        bVar66 = (bool)((byte)uVar69 & 1);
        auVar120._0_4_ = (uint)bVar66 * auVar91._0_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
        auVar120._4_4_ = (uint)bVar66 * auVar91._4_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
        auVar120._8_4_ = (uint)bVar66 * auVar91._8_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
        auVar120._12_4_ = (uint)bVar66 * auVar91._12_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
        auVar120._16_4_ = (uint)bVar66 * auVar91._16_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
        auVar120._20_4_ = (uint)bVar66 * auVar91._20_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
        auVar120._24_4_ = (uint)bVar66 * auVar91._24_4_ | (uint)!bVar66 * -0x800000;
        bVar66 = SUB81(uVar69 >> 7,0);
        auVar120._28_4_ = (uint)bVar66 * auVar91._28_4_ | (uint)!bVar66 * -0x800000;
        auVar29._8_4_ = 0x36000000;
        auVar29._0_8_ = 0x3600000036000000;
        auVar29._12_4_ = 0x36000000;
        auVar29._16_4_ = 0x36000000;
        auVar29._20_4_ = 0x36000000;
        auVar29._24_4_ = 0x36000000;
        auVar29._28_4_ = 0x36000000;
        auVar91 = vmulps_avx512vl(local_540,auVar29);
        uVar63 = vcmpps_avx512vl(auVar91,local_560,0xe);
        uVar69 = uVar69 & uVar63;
        bVar62 = (byte)uVar69;
        if (bVar62 != 0) {
          uVar63 = vcmpps_avx512vl(auVar89,ZEXT1632(auVar74),2);
          auVar221._8_4_ = 0x7f800000;
          auVar221._0_8_ = 0x7f8000007f800000;
          auVar221._12_4_ = 0x7f800000;
          auVar221._16_4_ = 0x7f800000;
          auVar221._20_4_ = 0x7f800000;
          auVar221._24_4_ = 0x7f800000;
          auVar221._28_4_ = 0x7f800000;
          auVar230._8_4_ = 0xff800000;
          auVar230._0_8_ = 0xff800000ff800000;
          auVar230._12_4_ = 0xff800000;
          auVar230._16_4_ = 0xff800000;
          auVar230._20_4_ = 0xff800000;
          auVar230._24_4_ = 0xff800000;
          auVar230._28_4_ = 0xff800000;
          auVar89 = vblendmps_avx512vl(auVar221,auVar230);
          bVar59 = (byte)uVar63;
          uVar70 = (uint)(bVar59 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar91._0_4_;
          bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
          uVar126 = (uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * auVar91._4_4_;
          bVar66 = (bool)((byte)(uVar63 >> 2) & 1);
          uVar127 = (uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * auVar91._8_4_;
          bVar66 = (bool)((byte)(uVar63 >> 3) & 1);
          uVar128 = (uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * auVar91._12_4_;
          bVar66 = (bool)((byte)(uVar63 >> 4) & 1);
          uVar129 = (uint)bVar66 * auVar89._16_4_ | (uint)!bVar66 * auVar91._16_4_;
          bVar66 = (bool)((byte)(uVar63 >> 5) & 1);
          uVar130 = (uint)bVar66 * auVar89._20_4_ | (uint)!bVar66 * auVar91._20_4_;
          bVar66 = (bool)((byte)(uVar63 >> 6) & 1);
          uVar131 = (uint)bVar66 * auVar89._24_4_ | (uint)!bVar66 * auVar91._24_4_;
          bVar66 = SUB81(uVar63 >> 7,0);
          uVar132 = (uint)bVar66 * auVar89._28_4_ | (uint)!bVar66 * auVar91._28_4_;
          auVar119._0_4_ = (bVar62 & 1) * uVar70 | !(bool)(bVar62 & 1) * auVar119._0_4_;
          bVar66 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar119._4_4_ = bVar66 * uVar126 | !bVar66 * auVar119._4_4_;
          bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar119._8_4_ = bVar66 * uVar127 | !bVar66 * auVar119._8_4_;
          bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar119._12_4_ = bVar66 * uVar128 | !bVar66 * auVar119._12_4_;
          bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar119._16_4_ = bVar66 * uVar129 | !bVar66 * auVar119._16_4_;
          bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar119._20_4_ = bVar66 * uVar130 | !bVar66 * auVar119._20_4_;
          bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar119._24_4_ = bVar66 * uVar131 | !bVar66 * auVar119._24_4_;
          bVar66 = SUB81(uVar69 >> 7,0);
          auVar119._28_4_ = bVar66 * uVar132 | !bVar66 * auVar119._28_4_;
          auVar89 = vblendmps_avx512vl(auVar230,auVar221);
          bVar66 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar4 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar5 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar6 = (bool)((byte)(uVar63 >> 4) & 1);
          bVar7 = (bool)((byte)(uVar63 >> 5) & 1);
          bVar8 = (bool)((byte)(uVar63 >> 6) & 1);
          bVar9 = SUB81(uVar63 >> 7,0);
          auVar120._0_4_ =
               (uint)(bVar62 & 1) *
               ((uint)(bVar59 & 1) * auVar89._0_4_ | !(bool)(bVar59 & 1) * uVar70) |
               !(bool)(bVar62 & 1) * auVar120._0_4_;
          bVar3 = (bool)((byte)(uVar69 >> 1) & 1);
          auVar120._4_4_ =
               (uint)bVar3 * ((uint)bVar66 * auVar89._4_4_ | !bVar66 * uVar126) |
               !bVar3 * auVar120._4_4_;
          bVar66 = (bool)((byte)(uVar69 >> 2) & 1);
          auVar120._8_4_ =
               (uint)bVar66 * ((uint)bVar4 * auVar89._8_4_ | !bVar4 * uVar127) |
               !bVar66 * auVar120._8_4_;
          bVar66 = (bool)((byte)(uVar69 >> 3) & 1);
          auVar120._12_4_ =
               (uint)bVar66 * ((uint)bVar5 * auVar89._12_4_ | !bVar5 * uVar128) |
               !bVar66 * auVar120._12_4_;
          bVar66 = (bool)((byte)(uVar69 >> 4) & 1);
          auVar120._16_4_ =
               (uint)bVar66 * ((uint)bVar6 * auVar89._16_4_ | !bVar6 * uVar129) |
               !bVar66 * auVar120._16_4_;
          bVar66 = (bool)((byte)(uVar69 >> 5) & 1);
          auVar120._20_4_ =
               (uint)bVar66 * ((uint)bVar7 * auVar89._20_4_ | !bVar7 * uVar130) |
               !bVar66 * auVar120._20_4_;
          bVar66 = (bool)((byte)(uVar69 >> 6) & 1);
          auVar120._24_4_ =
               (uint)bVar66 * ((uint)bVar8 * auVar89._24_4_ | !bVar8 * uVar131) |
               !bVar66 * auVar120._24_4_;
          bVar66 = SUB81(uVar69 >> 7,0);
          auVar120._28_4_ =
               (uint)bVar66 * ((uint)bVar9 * auVar89._28_4_ | !bVar9 * uVar132) |
               !bVar66 * auVar120._28_4_;
          bVar64 = (~bVar62 | bVar59) & bVar64;
        }
      }
      auVar220._0_4_ = (float)local_400._0_4_ * auVar216._0_4_;
      auVar220._4_4_ = (float)local_400._4_4_ * auVar216._4_4_;
      auVar220._8_4_ = fStack_3f8 * auVar216._8_4_;
      auVar220._12_4_ = fStack_3f4 * auVar216._12_4_;
      auVar220._16_4_ = fStack_3f0 * auVar216._16_4_;
      auVar220._20_4_ = fStack_3ec * auVar216._20_4_;
      auVar220._28_36_ = auVar216._28_36_;
      auVar220._24_4_ = fStack_3e8 * auVar216._24_4_;
      auVar73 = vfmadd231ps_fma(auVar220._0_32_,local_3e0,auVar90);
      auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_3c0,auVar81);
      auVar219._8_4_ = 0x7fffffff;
      auVar219._0_8_ = 0x7fffffff7fffffff;
      auVar219._12_4_ = 0x7fffffff;
      auVar219._16_4_ = 0x7fffffff;
      auVar219._20_4_ = 0x7fffffff;
      auVar219._24_4_ = 0x7fffffff;
      auVar219._28_4_ = 0x7fffffff;
      auVar89 = vandps_avx(ZEXT1632(auVar73),auVar219);
      _local_1c0 = local_3a0;
      auVar215._8_4_ = 0x3e99999a;
      auVar215._0_8_ = 0x3e99999a3e99999a;
      auVar215._12_4_ = 0x3e99999a;
      auVar215._16_4_ = 0x3e99999a;
      auVar215._20_4_ = 0x3e99999a;
      auVar215._24_4_ = 0x3e99999a;
      auVar215._28_4_ = 0x3e99999a;
      uVar12 = vcmpps_avx512vl(auVar89,auVar215,1);
      _local_2e0 = vmaxps_avx(local_3a0,auVar120);
      auVar89 = vminps_avx(local_2c0,auVar119);
      uVar14 = vcmpps_avx512vl(local_3a0,auVar89,2);
      bVar62 = (byte)uVar14 & bVar58;
      uVar13 = vcmpps_avx512vl(_local_2e0,local_2c0,2);
      if ((bVar58 & ((byte)uVar13 | (byte)uVar14)) == 0) {
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar242 = ZEXT3264(auVar89);
        auVar210 = ZEXT3264(_DAT_01f7b040);
        auVar240 = ZEXT3264(local_700);
        auVar239 = ZEXT3264(local_720);
        auVar232 = ZEXT3264(local_740);
        auVar220 = ZEXT3264(local_760);
        auVar222 = ZEXT3264(local_780);
        auVar227 = ZEXT3264(local_7a0);
        auVar216 = ZEXT3264(local_7c0);
      }
      else {
        _local_360 = _local_2e0;
        local_8b0 = (uint)(byte)((byte)uVar12 | ~bVar64);
        auVar52._4_4_ = (float)local_400._4_4_ * auVar226._4_4_;
        auVar52._0_4_ = (float)local_400._0_4_ * auVar226._0_4_;
        auVar52._8_4_ = fStack_3f8 * auVar226._8_4_;
        auVar52._12_4_ = fStack_3f4 * auVar226._12_4_;
        auVar52._16_4_ = fStack_3f0 * auVar226._16_4_;
        auVar52._20_4_ = fStack_3ec * auVar226._20_4_;
        auVar52._24_4_ = fStack_3e8 * auVar226._24_4_;
        auVar52._28_4_ = auVar89._28_4_;
        auVar73 = vfmadd213ps_fma(auVar94,local_3e0,auVar52);
        auVar73 = vfmadd213ps_fma(auVar80,local_3c0,ZEXT1632(auVar73));
        auVar89 = vandps_avx(ZEXT1632(auVar73),auVar219);
        uVar12 = vcmpps_avx512vl(auVar89,auVar215,1);
        bVar64 = (byte)uVar12 | ~bVar64;
        auVar141._8_4_ = 2;
        auVar141._0_8_ = 0x200000002;
        auVar141._12_4_ = 2;
        auVar141._16_4_ = 2;
        auVar141._20_4_ = 2;
        auVar141._24_4_ = 2;
        auVar141._28_4_ = 2;
        auVar30._8_4_ = 3;
        auVar30._0_8_ = 0x300000003;
        auVar30._12_4_ = 3;
        auVar30._16_4_ = 3;
        auVar30._20_4_ = 3;
        auVar30._24_4_ = 3;
        auVar30._28_4_ = 3;
        auVar89 = vpblendmd_avx512vl(auVar141,auVar30);
        local_2a0._0_4_ = (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * 2;
        bVar66 = (bool)(bVar64 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar66 * auVar89._16_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar66 * auVar89._20_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)(bVar64 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar66 * auVar89._24_4_ | (uint)!bVar66 * 2;
        local_2a0._28_4_ = (uint)(bVar64 >> 7) * auVar89._28_4_ | (uint)!(bool)(bVar64 >> 7) * 2;
        local_300 = vpbroadcastd_avx512vl();
        uVar12 = vpcmpd_avx512vl(local_300,local_2a0,5);
        local_8ac = (uint)bVar62;
        local_340 = local_3a0._0_4_ + (float)local_380._0_4_;
        fStack_33c = local_3a0._4_4_ + (float)local_380._4_4_;
        fStack_338 = local_3a0._8_4_ + fStack_378;
        fStack_334 = local_3a0._12_4_ + fStack_374;
        fStack_330 = local_3a0._16_4_ + fStack_370;
        fStack_32c = local_3a0._20_4_ + fStack_36c;
        fStack_328 = local_3a0._24_4_ + fStack_368;
        fStack_324 = local_3a0._28_4_ + fStack_364;
        for (bVar62 = (byte)uVar12 & bVar62; bVar62 != 0; bVar62 = ~bVar64 & bVar62 & (byte)uVar12)
        {
          auVar142._8_4_ = 0x7f800000;
          auVar142._0_8_ = 0x7f8000007f800000;
          auVar142._12_4_ = 0x7f800000;
          auVar142._16_4_ = 0x7f800000;
          auVar142._20_4_ = 0x7f800000;
          auVar142._24_4_ = 0x7f800000;
          auVar142._28_4_ = 0x7f800000;
          auVar89 = vblendmps_avx512vl(auVar142,local_3a0);
          auVar122._0_4_ =
               (uint)(bVar62 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar62 & 1) * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 1 & 1);
          auVar122._4_4_ = (uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 2 & 1);
          auVar122._8_4_ = (uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 3 & 1);
          auVar122._12_4_ = (uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 4 & 1);
          auVar122._16_4_ = (uint)bVar66 * auVar89._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar62 >> 5 & 1);
          auVar122._20_4_ = (uint)bVar66 * auVar89._20_4_ | (uint)!bVar66 * 0x7f800000;
          auVar122._24_4_ =
               (uint)(bVar62 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar62 >> 6) * 0x7f800000;
          auVar122._28_4_ = 0x7f800000;
          auVar89 = vshufps_avx(auVar122,auVar122,0xb1);
          auVar89 = vminps_avx(auVar122,auVar89);
          auVar90 = vshufpd_avx(auVar89,auVar89,5);
          auVar89 = vminps_avx(auVar89,auVar90);
          auVar90 = vpermpd_avx2(auVar89,0x4e);
          auVar89 = vminps_avx(auVar89,auVar90);
          uVar12 = vcmpps_avx512vl(auVar122,auVar89,0);
          bVar59 = (byte)uVar12 & bVar62;
          bVar64 = bVar62;
          if (bVar59 != 0) {
            bVar64 = bVar59;
          }
          iVar15 = 0;
          for (uVar70 = (uint)bVar64; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar64 = '\x01' << ((byte)iVar15 & 0x1f);
          auVar210 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
          fVar162 = local_8a8;
          fVar146 = *(float *)(local_1e0 + (uint)(iVar15 << 2));
          uVar147 = 0;
          uVar223 = 0;
          uVar224 = 0;
          if ((float)local_6a0._0_4_ < 0.0) {
            local_840._0_16_ = ZEXT416((uint)*(float *)(local_1e0 + (uint)(iVar15 << 2)));
            local_6c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar15 << 2)));
            auVar235 = ZEXT1664(auVar235._0_16_);
            fVar162 = sqrtf((float)local_6a0._0_4_);
            auVar210 = ZEXT1664(local_6c0._0_16_);
            auVar238 = ZEXT3264(local_8a0);
            auVar236 = ZEXT3264(local_880);
            fVar146 = (float)local_840._0_4_;
            uVar147 = local_840._4_4_;
            uVar223 = local_840._8_4_;
            uVar224 = local_840._12_4_;
          }
          uVar69 = (ulong)bVar64;
          auVar74 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar73 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar71 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar75 = vminps_avx(auVar74,auVar71);
          auVar74 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar71 = vmaxps_avx(auVar73,auVar74);
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar73 = vandps_avx(auVar75,auVar191);
          auVar74 = vandps_avx(auVar71,auVar191);
          auVar73 = vmaxps_avx(auVar73,auVar74);
          auVar74 = vmovshdup_avx(auVar73);
          auVar74 = vmaxss_avx(auVar74,auVar73);
          auVar73 = vshufpd_avx(auVar73,auVar73,1);
          auVar73 = vmaxss_avx(auVar73,auVar74);
          local_820._0_4_ = auVar73._0_4_ * 1.9073486e-06;
          local_610 = vshufps_avx(auVar71,auVar71,0xff);
          uVar63 = 0;
          while( true ) {
            auVar89 = local_840;
            bVar59 = (byte)uVar69;
            if (uVar63 == 5) break;
            uVar225 = auVar210._0_4_;
            auVar134._4_4_ = uVar225;
            auVar134._0_4_ = uVar225;
            auVar134._8_4_ = uVar225;
            auVar134._12_4_ = uVar225;
            auVar74 = vfmadd132ps_fma(auVar134,ZEXT816(0) << 0x40,local_690);
            fVar163 = 1.0 - fVar146;
            auVar168._0_4_ = local_5c0._0_4_ * fVar146;
            auVar168._4_4_ = local_5c0._4_4_ * fVar146;
            auVar168._8_4_ = local_5c0._8_4_ * fVar146;
            auVar168._12_4_ = local_5c0._12_4_ * fVar146;
            local_520._0_16_ = ZEXT416((uint)fVar163);
            auVar192._4_4_ = fVar163;
            auVar192._0_4_ = fVar163;
            auVar192._8_4_ = fVar163;
            auVar192._12_4_ = fVar163;
            auVar73 = vfmadd231ps_fma(auVar168,auVar192,local_580._0_16_);
            auVar196._0_4_ = local_5a0._0_4_ * fVar146;
            auVar196._4_4_ = local_5a0._4_4_ * fVar146;
            auVar196._8_4_ = local_5a0._8_4_ * fVar146;
            auVar196._12_4_ = local_5a0._12_4_ * fVar146;
            auVar71 = vfmadd231ps_fma(auVar196,auVar192,local_5c0._0_16_);
            auVar205._0_4_ = fVar146 * (float)local_5e0._0_4_;
            auVar205._4_4_ = fVar146 * (float)local_5e0._4_4_;
            auVar205._8_4_ = fVar146 * fStack_5d8;
            auVar205._12_4_ = fVar146 * fStack_5d4;
            auVar75 = vfmadd231ps_fma(auVar205,auVar192,local_5a0._0_16_);
            auVar212._0_4_ = fVar146 * auVar71._0_4_;
            auVar212._4_4_ = fVar146 * auVar71._4_4_;
            auVar212._8_4_ = fVar146 * auVar71._8_4_;
            auVar212._12_4_ = fVar146 * auVar71._12_4_;
            auVar73 = vfmadd231ps_fma(auVar212,auVar192,auVar73);
            auVar169._0_4_ = fVar146 * auVar75._0_4_;
            auVar169._4_4_ = fVar146 * auVar75._4_4_;
            auVar169._8_4_ = fVar146 * auVar75._8_4_;
            auVar169._12_4_ = fVar146 * auVar75._12_4_;
            auVar71 = vfmadd231ps_fma(auVar169,auVar192,auVar71);
            auVar197._0_4_ = fVar146 * auVar71._0_4_;
            auVar197._4_4_ = fVar146 * auVar71._4_4_;
            auVar197._8_4_ = fVar146 * auVar71._8_4_;
            auVar197._12_4_ = fVar146 * auVar71._12_4_;
            auVar75 = vfmadd231ps_fma(auVar197,auVar73,auVar192);
            auVar73 = vsubps_avx(auVar71,auVar73);
            auVar17._8_4_ = 0x40400000;
            auVar17._0_8_ = 0x4040000040400000;
            auVar17._12_4_ = 0x40400000;
            auVar71 = vmulps_avx512vl(auVar73,auVar17);
            _local_500 = auVar75;
            auVar73 = vsubps_avx(auVar74,auVar75);
            local_860._0_16_ = auVar73;
            auVar73 = vdpps_avx(auVar73,auVar73,0x7f);
            local_6e0._0_16_ = auVar73;
            local_840._4_4_ = uVar147;
            local_840._0_4_ = fVar146;
            local_840._8_4_ = uVar223;
            local_840._16_16_ = auVar89._16_16_;
            local_840._12_4_ = uVar224;
            local_6c0._0_16_ = auVar210._0_16_;
            if (auVar73._0_4_ < 0.0) {
              auVar222._0_4_ = sqrtf(auVar73._0_4_);
              auVar222._4_60_ = extraout_var;
              auVar73 = auVar222._0_16_;
              uVar69 = extraout_RAX;
            }
            else {
              auVar73 = vsqrtss_avx(auVar73,auVar73);
            }
            local_660._0_16_ = vdpps_avx(auVar71,auVar71,0x7f);
            fVar146 = local_660._0_4_;
            auVar170._4_12_ = ZEXT812(0) << 0x20;
            auVar170._0_4_ = fVar146;
            local_680._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
            fVar163 = local_680._0_4_;
            local_540._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar170);
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar75 = vxorps_avx512vl(local_660._0_16_,auVar18);
            auVar74 = vfnmadd213ss_fma(local_540._0_16_,local_660._0_16_,ZEXT416(0x40000000));
            local_560._0_4_ = auVar74._0_4_;
            local_640._0_4_ = auVar73._0_4_;
            if (fVar146 < auVar75._0_4_) {
              auVar227._0_4_ = sqrtf(fVar146);
              auVar227._4_60_ = extraout_var_00;
              auVar73 = ZEXT416((uint)local_640._0_4_);
              auVar74 = auVar227._0_16_;
              uVar69 = extraout_RAX_00;
            }
            else {
              auVar74 = vsqrtss_avx(local_660._0_16_,local_660._0_16_);
            }
            auVar235 = ZEXT1664(auVar74);
            fVar164 = local_680._0_4_;
            fVar146 = fVar163 * 1.5 + fVar146 * -0.5 * fVar164 * fVar164 * fVar164;
            local_680._0_4_ = auVar71._0_4_ * fVar146;
            local_680._4_4_ = auVar71._4_4_ * fVar146;
            local_680._8_4_ = auVar71._8_4_ * fVar146;
            local_680._12_4_ = auVar71._12_4_ * fVar146;
            auVar75 = vdpps_avx(local_860._0_16_,local_680._0_16_,0x7f);
            fVar166 = auVar73._0_4_;
            fVar163 = auVar75._0_4_;
            auVar135._0_4_ = fVar163 * fVar163;
            auVar135._4_4_ = auVar75._4_4_ * auVar75._4_4_;
            auVar135._8_4_ = auVar75._8_4_ * auVar75._8_4_;
            auVar135._12_4_ = auVar75._12_4_ * auVar75._12_4_;
            auVar76 = vsubps_avx512vl(local_6e0._0_16_,auVar135);
            fVar164 = auVar76._0_4_;
            auVar150._4_12_ = ZEXT812(0) << 0x20;
            auVar150._0_4_ = fVar164;
            auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar150);
            auVar78 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
            auVar72 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
            if (fVar164 < 0.0) {
              local_600 = fVar146;
              fStack_5fc = fVar146;
              fStack_5f8 = fVar146;
              fStack_5f4 = fVar146;
              local_5f0 = auVar77;
              fVar164 = sqrtf(fVar164);
              auVar72 = ZEXT416(auVar72._0_4_);
              auVar78 = ZEXT416(auVar78._0_4_);
              auVar235 = ZEXT464(auVar74._0_4_);
              auVar73 = ZEXT416((uint)local_640._0_4_);
              uVar69 = extraout_RAX_01;
              auVar77 = local_5f0;
              fVar146 = local_600;
              fVar165 = fStack_5fc;
              fVar189 = fStack_5f8;
              fVar167 = fStack_5f4;
            }
            else {
              auVar74 = vsqrtss_avx(auVar76,auVar76);
              fVar164 = auVar74._0_4_;
              fVar165 = fVar146;
              fVar189 = fVar146;
              fVar167 = fVar146;
            }
            auVar236 = ZEXT3264(local_880);
            auVar238 = ZEXT3264(local_8a0);
            auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_840._0_16_,
                                      local_520._0_16_);
            fVar148 = auVar74._0_4_ * 6.0;
            fVar11 = local_840._0_4_ * 6.0;
            auVar171._0_4_ = fVar11 * (float)local_5e0._0_4_;
            auVar171._4_4_ = fVar11 * (float)local_5e0._4_4_;
            auVar171._8_4_ = fVar11 * fStack_5d8;
            auVar171._12_4_ = fVar11 * fStack_5d4;
            auVar151._4_4_ = fVar148;
            auVar151._0_4_ = fVar148;
            auVar151._8_4_ = fVar148;
            auVar151._12_4_ = fVar148;
            auVar74 = vfmadd132ps_fma(auVar151,auVar171,local_5a0._0_16_);
            auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_520._0_16_,
                                      local_840._0_16_);
            fVar148 = auVar76._0_4_ * 6.0;
            auVar172._4_4_ = fVar148;
            auVar172._0_4_ = fVar148;
            auVar172._8_4_ = fVar148;
            auVar172._12_4_ = fVar148;
            auVar74 = vfmadd132ps_fma(auVar172,auVar74,local_5c0._0_16_);
            fVar148 = local_520._0_4_ * 6.0;
            auVar152._4_4_ = fVar148;
            auVar152._0_4_ = fVar148;
            auVar152._8_4_ = fVar148;
            auVar152._12_4_ = fVar148;
            auVar74 = vfmadd132ps_fma(auVar152,auVar74,local_580._0_16_);
            auVar173._0_4_ = auVar74._0_4_ * (float)local_660._0_4_;
            auVar173._4_4_ = auVar74._4_4_ * (float)local_660._0_4_;
            auVar173._8_4_ = auVar74._8_4_ * (float)local_660._0_4_;
            auVar173._12_4_ = auVar74._12_4_ * (float)local_660._0_4_;
            auVar74 = vdpps_avx(auVar71,auVar74,0x7f);
            fVar148 = auVar74._0_4_;
            auVar153._0_4_ = auVar71._0_4_ * fVar148;
            auVar153._4_4_ = auVar71._4_4_ * fVar148;
            auVar153._8_4_ = auVar71._8_4_ * fVar148;
            auVar153._12_4_ = auVar71._12_4_ * fVar148;
            auVar74 = vsubps_avx(auVar173,auVar153);
            fVar148 = (float)local_560._0_4_ * (float)local_540._0_4_;
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar124._16_16_ = local_8a0._16_16_;
            auVar79 = vxorps_avx512vl(auVar71,auVar19);
            auVar198._0_4_ = fVar146 * auVar74._0_4_ * fVar148;
            auVar198._4_4_ = fVar165 * auVar74._4_4_ * fVar148;
            auVar198._8_4_ = fVar189 * auVar74._8_4_ * fVar148;
            auVar198._12_4_ = fVar167 * auVar74._12_4_ * fVar148;
            auVar74 = vdpps_avx(auVar79,local_680._0_16_,0x7f);
            auVar237 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                  ZEXT416((uint)((float)local_6c0._0_4_ * fVar162 * 1.9073486e-06)))
            ;
            auVar76 = vdpps_avx(local_860._0_16_,auVar198,0x7f);
            auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)local_820._0_4_),auVar237);
            auVar10 = vfmadd213ss_fma(ZEXT416((uint)(fVar166 + 1.0)),
                                      ZEXT416((uint)((float)local_820._0_4_ / auVar235._0_4_)),
                                      auVar73);
            auVar73 = vdpps_avx(local_690,local_680._0_16_,0x7f);
            fVar166 = auVar74._0_4_ + auVar76._0_4_;
            auVar74 = vdpps_avx(local_860._0_16_,auVar79,0x7f);
            auVar76 = vmulss_avx512f(auVar72,auVar77);
            auVar72 = vmulss_avx512f(auVar77,auVar77);
            auVar77 = vdpps_avx(local_860._0_16_,local_690,0x7f);
            auVar72 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar76._0_4_ * auVar72._0_4_)));
            auVar76 = vfnmadd231ss_fma(auVar74,auVar75,ZEXT416((uint)fVar166));
            auVar78 = vfnmadd231ss_fma(auVar77,auVar75,auVar73);
            auVar74 = vpermilps_avx(_local_500,0xff);
            fVar164 = fVar164 - auVar74._0_4_;
            auVar74 = vshufps_avx(auVar71,auVar71,0xff);
            auVar77 = vfmsub213ss_fma(auVar76,auVar72,auVar74);
            fVar146 = auVar78._0_4_ * auVar72._0_4_;
            auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar77._0_4_)),
                                      ZEXT416((uint)fVar166),ZEXT416((uint)fVar146));
            fVar165 = auVar76._0_4_;
            fVar146 = local_840._0_4_ -
                      (fVar163 * (fVar146 / fVar165) - fVar164 * (auVar73._0_4_ / fVar165));
            uVar147 = 0;
            uVar223 = 0;
            uVar224 = 0;
            fVar163 = (float)local_6c0._0_4_ -
                      (fVar164 * (fVar166 / fVar165) - fVar163 * (auVar77._0_4_ / fVar165));
            auVar210 = ZEXT464((uint)fVar163);
            auVar20._8_4_ = 0x7fffffff;
            auVar20._0_8_ = 0x7fffffff7fffffff;
            auVar20._12_4_ = 0x7fffffff;
            auVar73 = vandps_avx512vl(auVar75,auVar20);
            if (auVar73._0_4_ < auVar10._0_4_) {
              auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar10._0_4_ + auVar237._0_4_)),local_610,
                                        ZEXT416(0x36000000));
              auVar21._8_4_ = 0x7fffffff;
              auVar21._0_8_ = 0x7fffffff7fffffff;
              auVar21._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(ZEXT416((uint)fVar164),auVar21);
              if (auVar75._0_4_ < auVar73._0_4_) {
                bVar66 = uVar63 < 5;
                fVar163 = fVar163 + (float)local_620._0_4_;
                if (fVar163 < fVar234) {
LAB_01a0caf8:
                  bVar59 = 0;
                  goto LAB_01a0cb00;
                }
                fVar162 = *(float *)(ray + k * 4 + 0x80);
                if (fVar163 <= fVar162) {
                  bVar59 = 0;
                  if ((fVar146 < 0.0) || (1.0 < fVar146)) goto LAB_01a0cb00;
                  auVar124._0_16_ = ZEXT816(0) << 0x20;
                  auVar123._4_28_ = auVar124._4_28_;
                  auVar123._0_4_ = local_6e0._0_4_;
                  auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar123._0_16_);
                  fVar164 = auVar73._0_4_;
                  auVar73 = vmulss_avx512f(local_6e0._0_16_,ZEXT416(0xbf000000));
                  pGVar65 = (context->scene->geometries).items[local_7f8].ptr;
                  if ((pGVar65->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01a0caf8;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar59 = 1, pGVar65->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a0cb00;
                  fVar164 = fVar164 * 1.5 + auVar73._0_4_ * fVar164 * fVar164 * fVar164;
                  auVar174._0_4_ = local_860._0_4_ * fVar164;
                  auVar174._4_4_ = local_860._4_4_ * fVar164;
                  auVar174._8_4_ = local_860._8_4_ * fVar164;
                  auVar174._12_4_ = local_860._12_4_ * fVar164;
                  auVar75 = vfmadd213ps_fma(auVar74,auVar174,auVar71);
                  auVar73 = vshufps_avx(auVar174,auVar174,0xc9);
                  auVar74 = vshufps_avx(auVar71,auVar71,0xc9);
                  auVar175._0_4_ = auVar174._0_4_ * auVar74._0_4_;
                  auVar175._4_4_ = auVar174._4_4_ * auVar74._4_4_;
                  auVar175._8_4_ = auVar174._8_4_ * auVar74._8_4_;
                  auVar175._12_4_ = auVar174._12_4_ * auVar74._12_4_;
                  auVar71 = vfmsub231ps_fma(auVar175,auVar71,auVar73);
                  auVar73 = vshufps_avx(auVar71,auVar71,0xc9);
                  auVar74 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar71 = vshufps_avx(auVar71,auVar71,0xd2);
                  auVar136._0_4_ = auVar75._0_4_ * auVar71._0_4_;
                  auVar136._4_4_ = auVar75._4_4_ * auVar71._4_4_;
                  auVar136._8_4_ = auVar75._8_4_ * auVar71._8_4_;
                  auVar136._12_4_ = auVar75._12_4_ * auVar71._12_4_;
                  auVar73 = vfmsub231ps_fma(auVar136,auVar73,auVar74);
                  local_4a0 = (RTCHitN  [16])vshufps_avx(auVar73,auVar73,0x55);
                  auStack_490 = vshufps_avx(auVar73,auVar73,0xaa);
                  local_480 = auVar73._0_4_;
                  uStack_47c = local_480;
                  uStack_478 = local_480;
                  uStack_474 = local_480;
                  local_470 = fVar146;
                  fStack_46c = fVar146;
                  fStack_468 = fVar146;
                  fStack_464 = fVar146;
                  local_460 = ZEXT416(0) << 0x20;
                  local_450 = local_4b0._0_8_;
                  uStack_448 = local_4b0._8_8_;
                  local_440 = local_4c0;
                  vpcmpeqd_avx2(ZEXT1632(local_4c0),ZEXT1632(local_4c0));
                  uStack_42c = context->user->instID[0];
                  local_430 = uStack_42c;
                  uStack_428 = uStack_42c;
                  uStack_424 = uStack_42c;
                  uStack_420 = context->user->instPrimID[0];
                  uStack_41c = uStack_420;
                  uStack_418 = uStack_420;
                  uStack_414 = uStack_420;
                  *(float *)(ray + k * 4 + 0x80) = fVar163;
                  local_8c0 = local_4d0;
                  local_7f0.valid = (int *)local_8c0;
                  local_7f0.geometryUserPtr = pGVar65->userPtr;
                  local_7f0.context = context->user;
                  local_7f0.hit = local_4a0;
                  local_7f0.N = 4;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar65->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_860._0_8_ = pGVar65;
                    auVar235 = ZEXT1664(auVar235._0_16_);
                    (*pGVar65->occlusionFilterN)(&local_7f0);
                    auVar238 = ZEXT3264(local_8a0);
                    auVar236 = ZEXT3264(local_880);
                    pGVar65 = (Geometry *)local_860._0_8_;
                  }
                  uVar69 = vptestmd_avx512vl(local_8c0,local_8c0);
                  if ((uVar69 & 0xf) != 0) {
                    p_Var2 = context->args->filter;
                    if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      (*p_Var2)(&local_7f0);
                      auVar238 = ZEXT3264(local_8a0);
                      auVar236 = ZEXT3264(local_880);
                    }
                    uVar69 = vptestmd_avx512vl(local_8c0,local_8c0);
                    uVar69 = uVar69 & 0xf;
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar3 = (bool)((byte)uVar69 & 1);
                    bVar4 = (bool)((byte)(uVar69 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar69 >> 2) & 1);
                    bVar6 = SUB81(uVar69 >> 3,0);
                    *(uint *)(local_7f0.ray + 0x80) =
                         (uint)bVar3 * auVar73._0_4_ | (uint)!bVar3 * *(int *)(local_7f0.ray + 0x80)
                    ;
                    *(uint *)(local_7f0.ray + 0x84) =
                         (uint)bVar4 * auVar73._4_4_ | (uint)!bVar4 * *(int *)(local_7f0.ray + 0x84)
                    ;
                    *(uint *)(local_7f0.ray + 0x88) =
                         (uint)bVar5 * auVar73._8_4_ | (uint)!bVar5 * *(int *)(local_7f0.ray + 0x88)
                    ;
                    *(uint *)(local_7f0.ray + 0x8c) =
                         (uint)bVar6 * auVar73._12_4_ |
                         (uint)!bVar6 * *(int *)(local_7f0.ray + 0x8c);
                    bVar59 = 1;
                    if ((byte)uVar69 != 0) goto LAB_01a0cb00;
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar162;
                }
                bVar59 = 0;
                goto LAB_01a0cb00;
              }
            }
            uVar63 = uVar63 + 1;
          }
          bVar66 = false;
LAB_01a0cb00:
          bVar60 = bVar60 | bVar66 & bVar59;
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar208._4_4_ = uVar147;
          auVar208._0_4_ = uVar147;
          auVar208._8_4_ = uVar147;
          auVar208._12_4_ = uVar147;
          auVar208._16_4_ = uVar147;
          auVar208._20_4_ = uVar147;
          auVar208._24_4_ = uVar147;
          auVar208._28_4_ = uVar147;
          auVar210 = ZEXT3264(auVar208);
          auVar54._4_4_ = fStack_33c;
          auVar54._0_4_ = local_340;
          auVar54._8_4_ = fStack_338;
          auVar54._12_4_ = fStack_334;
          auVar54._16_4_ = fStack_330;
          auVar54._20_4_ = fStack_32c;
          auVar54._24_4_ = fStack_328;
          auVar54._28_4_ = fStack_324;
          uVar12 = vcmpps_avx512vl(auVar208,auVar54,0xd);
        }
        auVar143._0_4_ = (float)local_380._0_4_ + (float)local_360._0_4_;
        auVar143._4_4_ = (float)local_380._4_4_ + (float)local_360._4_4_;
        auVar143._8_4_ = fStack_378 + fStack_358;
        auVar143._12_4_ = fStack_374 + fStack_354;
        auVar143._16_4_ = fStack_370 + fStack_350;
        auVar143._20_4_ = fStack_36c + fStack_34c;
        auVar143._24_4_ = fStack_368 + fStack_348;
        auVar143._28_4_ = fStack_364 + fStack_344;
        uVar147 = auVar210._0_4_;
        auVar160._4_4_ = uVar147;
        auVar160._0_4_ = uVar147;
        auVar160._8_4_ = uVar147;
        auVar160._12_4_ = uVar147;
        auVar160._16_4_ = uVar147;
        auVar160._20_4_ = uVar147;
        auVar160._24_4_ = uVar147;
        auVar160._28_4_ = uVar147;
        uVar12 = vcmpps_avx512vl(auVar143,auVar160,2);
        auVar144._8_4_ = 2;
        auVar144._0_8_ = 0x200000002;
        auVar144._12_4_ = 2;
        auVar144._16_4_ = 2;
        auVar144._20_4_ = 2;
        auVar144._24_4_ = 2;
        auVar144._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar89 = vpblendmd_avx512vl(auVar144,auVar31);
        bVar66 = (bool)((byte)local_8b0 & 1);
        local_360._0_4_ = (uint)bVar66 * auVar89._0_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)((byte)(local_8b0 >> 1) & 1);
        local_360._4_4_ = (uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * 2;
        bVar66 = (bool)((byte)(local_8b0 >> 2) & 1);
        fStack_358 = (float)((uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)((byte)(local_8b0 >> 3) & 1);
        fStack_354 = (float)((uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)((byte)(local_8b0 >> 4) & 1);
        fStack_350 = (float)((uint)bVar66 * auVar89._16_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)((byte)(local_8b0 >> 5) & 1);
        fStack_34c = (float)((uint)bVar66 * auVar89._20_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)((byte)(local_8b0 >> 6) & 1);
        fStack_348 = (float)((uint)bVar66 * auVar89._24_4_ | (uint)!bVar66 * 2);
        bVar66 = (bool)((byte)(local_8b0 >> 7) & 1);
        fStack_344 = (float)((uint)bVar66 * auVar89._28_4_ | (uint)!bVar66 * 2);
        bVar58 = (byte)uVar13 & bVar58 & (byte)uVar12;
        uVar12 = vpcmpd_avx512vl(_local_360,local_300,2);
        local_3a0 = _local_2e0;
        local_340 = (float)local_380._0_4_ + (float)local_2e0._0_4_;
        fStack_33c = (float)local_380._4_4_ + (float)local_2e0._4_4_;
        fStack_338 = fStack_378 + fStack_2d8;
        fStack_334 = fStack_374 + fStack_2d4;
        fStack_330 = fStack_370 + fStack_2d0;
        fStack_32c = fStack_36c + fStack_2cc;
        fStack_328 = fStack_368 + fStack_2c8;
        fStack_324 = fStack_364 + fStack_2c4;
        auVar240 = ZEXT3264(local_700);
        auVar239 = ZEXT3264(local_720);
        auVar232 = ZEXT3264(local_740);
        auVar220 = ZEXT3264(local_760);
        auVar222 = ZEXT3264(local_780);
        auVar227 = ZEXT3264(local_7a0);
        auVar216 = ZEXT3264(local_7c0);
        for (bVar64 = (byte)uVar12 & bVar58; bVar64 != 0; bVar64 = ~bVar62 & bVar64 & (byte)uVar12)
        {
          auVar145._8_4_ = 0x7f800000;
          auVar145._0_8_ = 0x7f8000007f800000;
          auVar145._12_4_ = 0x7f800000;
          auVar145._16_4_ = 0x7f800000;
          auVar145._20_4_ = 0x7f800000;
          auVar145._24_4_ = 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar89 = vblendmps_avx512vl(auVar145,local_3a0);
          auVar125._0_4_ =
               (uint)(bVar64 & 1) * auVar89._0_4_ | (uint)!(bool)(bVar64 & 1) * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 1 & 1);
          auVar125._4_4_ = (uint)bVar66 * auVar89._4_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 2 & 1);
          auVar125._8_4_ = (uint)bVar66 * auVar89._8_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 3 & 1);
          auVar125._12_4_ = (uint)bVar66 * auVar89._12_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 4 & 1);
          auVar125._16_4_ = (uint)bVar66 * auVar89._16_4_ | (uint)!bVar66 * 0x7f800000;
          bVar66 = (bool)(bVar64 >> 5 & 1);
          auVar125._20_4_ = (uint)bVar66 * auVar89._20_4_ | (uint)!bVar66 * 0x7f800000;
          auVar125._24_4_ =
               (uint)(bVar64 >> 6) * auVar89._24_4_ | (uint)!(bool)(bVar64 >> 6) * 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar89 = vshufps_avx(auVar125,auVar125,0xb1);
          auVar89 = vminps_avx(auVar125,auVar89);
          auVar90 = vshufpd_avx(auVar89,auVar89,5);
          auVar89 = vminps_avx(auVar89,auVar90);
          auVar90 = vpermpd_avx2(auVar89,0x4e);
          auVar89 = vminps_avx(auVar89,auVar90);
          uVar12 = vcmpps_avx512vl(auVar125,auVar89,0);
          bVar59 = (byte)uVar12 & bVar64;
          bVar62 = bVar64;
          if (bVar59 != 0) {
            bVar62 = bVar59;
          }
          iVar15 = 0;
          for (uVar70 = (uint)bVar62; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x80000000) {
            iVar15 = iVar15 + 1;
          }
          bVar62 = '\x01' << ((byte)iVar15 & 0x1f);
          auVar210 = ZEXT464(*(uint *)(local_2c0 + (uint)(iVar15 << 2)));
          fVar162 = local_8a4;
          fVar146 = *(float *)(local_200 + (uint)(iVar15 << 2));
          uVar147 = 0;
          uVar223 = 0;
          uVar224 = 0;
          if ((float)local_6a0._0_4_ < 0.0) {
            local_6e0._0_16_ = ZEXT416((uint)*(float *)(local_200 + (uint)(iVar15 << 2)));
            local_840._0_16_ = ZEXT416(*(uint *)(local_2c0 + (uint)(iVar15 << 2)));
            auVar235 = ZEXT1664(auVar235._0_16_);
            fVar162 = sqrtf((float)local_6a0._0_4_);
            auVar210 = ZEXT1664(local_840._0_16_);
            auVar238 = ZEXT3264(local_8a0);
            auVar236 = ZEXT3264(local_880);
            auVar216 = ZEXT3264(local_7c0);
            auVar227 = ZEXT3264(local_7a0);
            auVar222 = ZEXT3264(local_780);
            auVar220 = ZEXT3264(local_760);
            auVar232 = ZEXT3264(local_740);
            auVar239 = ZEXT3264(local_720);
            auVar240 = ZEXT3264(local_700);
            fVar146 = (float)local_6e0._0_4_;
            uVar147 = local_6e0._4_4_;
            uVar223 = local_6e0._8_4_;
            uVar224 = local_6e0._12_4_;
          }
          uVar69 = (ulong)bVar62;
          auVar74 = vminps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar73 = vmaxps_avx(local_580._0_16_,local_5c0._0_16_);
          auVar71 = vminps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar75 = vminps_avx(auVar74,auVar71);
          auVar74 = vmaxps_avx(local_5a0._0_16_,local_5e0._0_16_);
          auVar71 = vmaxps_avx(auVar73,auVar74);
          auVar193._8_4_ = 0x7fffffff;
          auVar193._0_8_ = 0x7fffffff7fffffff;
          auVar193._12_4_ = 0x7fffffff;
          auVar73 = vandps_avx(auVar75,auVar193);
          auVar74 = vandps_avx(auVar71,auVar193);
          auVar73 = vmaxps_avx(auVar73,auVar74);
          auVar74 = vmovshdup_avx(auVar73);
          auVar74 = vmaxss_avx(auVar74,auVar73);
          auVar73 = vshufpd_avx(auVar73,auVar73,1);
          auVar73 = vmaxss_avx(auVar73,auVar74);
          fVar163 = auVar73._0_4_ * 1.9073486e-06;
          local_610 = vshufps_avx(auVar71,auVar71,0xff);
          uVar63 = 0;
          while( true ) {
            auVar89 = local_6e0;
            bVar59 = (byte)uVar69;
            if (uVar63 == 5) break;
            uVar225 = auVar210._0_4_;
            auVar137._4_4_ = uVar225;
            auVar137._0_4_ = uVar225;
            auVar137._8_4_ = uVar225;
            auVar137._12_4_ = uVar225;
            auVar74 = vfmadd132ps_fma(auVar137,ZEXT816(0) << 0x40,local_690);
            fVar164 = 1.0 - fVar146;
            auVar176._0_4_ = local_5c0._0_4_ * fVar146;
            auVar176._4_4_ = local_5c0._4_4_ * fVar146;
            auVar176._8_4_ = local_5c0._8_4_ * fVar146;
            auVar176._12_4_ = local_5c0._12_4_ * fVar146;
            local_520._0_16_ = ZEXT416((uint)fVar164);
            auVar194._4_4_ = fVar164;
            auVar194._0_4_ = fVar164;
            auVar194._8_4_ = fVar164;
            auVar194._12_4_ = fVar164;
            auVar73 = vfmadd231ps_fma(auVar176,auVar194,local_580._0_16_);
            auVar199._0_4_ = local_5a0._0_4_ * fVar146;
            auVar199._4_4_ = local_5a0._4_4_ * fVar146;
            auVar199._8_4_ = local_5a0._8_4_ * fVar146;
            auVar199._12_4_ = local_5a0._12_4_ * fVar146;
            auVar71 = vfmadd231ps_fma(auVar199,auVar194,local_5c0._0_16_);
            auVar206._0_4_ = fVar146 * (float)local_5e0._0_4_;
            auVar206._4_4_ = fVar146 * (float)local_5e0._4_4_;
            auVar206._8_4_ = fVar146 * fStack_5d8;
            auVar206._12_4_ = fVar146 * fStack_5d4;
            auVar75 = vfmadd231ps_fma(auVar206,auVar194,local_5a0._0_16_);
            auVar213._0_4_ = fVar146 * auVar71._0_4_;
            auVar213._4_4_ = fVar146 * auVar71._4_4_;
            auVar213._8_4_ = fVar146 * auVar71._8_4_;
            auVar213._12_4_ = fVar146 * auVar71._12_4_;
            auVar73 = vfmadd231ps_fma(auVar213,auVar194,auVar73);
            auVar177._0_4_ = fVar146 * auVar75._0_4_;
            auVar177._4_4_ = fVar146 * auVar75._4_4_;
            auVar177._8_4_ = fVar146 * auVar75._8_4_;
            auVar177._12_4_ = fVar146 * auVar75._12_4_;
            auVar71 = vfmadd231ps_fma(auVar177,auVar194,auVar71);
            auVar200._0_4_ = fVar146 * auVar71._0_4_;
            auVar200._4_4_ = fVar146 * auVar71._4_4_;
            auVar200._8_4_ = fVar146 * auVar71._8_4_;
            auVar200._12_4_ = fVar146 * auVar71._12_4_;
            auVar75 = vfmadd231ps_fma(auVar200,auVar73,auVar194);
            auVar73 = vsubps_avx(auVar71,auVar73);
            auVar22._8_4_ = 0x40400000;
            auVar22._0_8_ = 0x4040000040400000;
            auVar22._12_4_ = 0x40400000;
            auVar71 = vmulps_avx512vl(auVar73,auVar22);
            _local_500 = auVar75;
            auVar74 = vsubps_avx(auVar74,auVar75);
            auVar73 = vdpps_avx(auVar74,auVar74,0x7f);
            local_860._0_16_ = auVar71;
            local_6c0._0_16_ = auVar73;
            local_6e0._4_4_ = uVar147;
            local_6e0._0_4_ = fVar146;
            local_6e0._8_4_ = uVar223;
            local_6e0._16_16_ = auVar89._16_16_;
            local_6e0._12_4_ = uVar224;
            local_840._0_16_ = auVar210._0_16_;
            if (auVar73._0_4_ < 0.0) {
              auVar232._0_4_ = sqrtf(auVar73._0_4_);
              auVar232._4_60_ = extraout_var_01;
              auVar73 = auVar232._0_16_;
              uVar69 = extraout_RAX_02;
              auVar71 = local_860._0_16_;
            }
            else {
              auVar73 = vsqrtss_avx(auVar73,auVar73);
            }
            local_540._0_16_ = vdpps_avx(auVar71,auVar71,0x7f);
            fVar164 = local_540._0_4_;
            auVar178._4_12_ = ZEXT812(0) << 0x20;
            auVar178._0_4_ = fVar164;
            local_660._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            fVar146 = local_660._0_4_ * 1.5;
            local_560._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar77 = vxorps_avx512vl(local_540._0_16_,auVar23);
            auVar75 = vfnmadd213ss_fma(local_560._0_16_,local_540._0_16_,ZEXT416(0x40000000));
            local_680._0_4_ = auVar75._0_4_;
            local_640._0_4_ = auVar73._0_4_;
            if (fVar164 < auVar77._0_4_) {
              local_820._0_4_ = fVar146;
              fVar166 = sqrtf(fVar164);
              auVar73 = ZEXT416((uint)local_640._0_4_);
              uVar69 = extraout_RAX_03;
              auVar71 = local_860._0_16_;
            }
            else {
              auVar75 = vsqrtss_avx(local_540._0_16_,local_540._0_16_);
              fVar166 = auVar75._0_4_;
              local_820._0_4_ = fVar146;
            }
            fVar146 = local_660._0_4_;
            fVar146 = (float)local_820._0_4_ + fVar164 * -0.5 * fVar146 * fVar146 * fVar146;
            local_820._0_4_ = auVar71._0_4_ * fVar146;
            local_820._4_4_ = auVar71._4_4_ * fVar146;
            local_820._8_4_ = auVar71._8_4_ * fVar146;
            local_820._12_4_ = auVar71._12_4_ * fVar146;
            local_660._0_16_ = vdpps_avx(local_820,auVar74,0x7f);
            auVar76 = vaddss_avx512f(auVar73,ZEXT416(0x3f800000));
            auVar138._0_4_ = local_660._0_4_ * local_660._0_4_;
            auVar138._4_4_ = local_660._4_4_ * local_660._4_4_;
            auVar138._8_4_ = local_660._8_4_ * local_660._8_4_;
            auVar138._12_4_ = local_660._12_4_ * local_660._12_4_;
            auVar75 = vsubps_avx(local_6c0._0_16_,auVar138);
            fVar164 = auVar75._0_4_;
            auVar154._4_12_ = ZEXT812(0) << 0x20;
            auVar154._0_4_ = fVar164;
            auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar154);
            auVar78 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
            auVar72 = vmulss_avx512f(auVar75,ZEXT416(0xbf000000));
            uVar68 = fVar164 == 0.0;
            uVar67 = fVar164 < 0.0;
            if ((bool)uVar67) {
              local_600 = fVar146;
              fStack_5fc = fVar146;
              fStack_5f8 = fVar146;
              fStack_5f4 = fVar146;
              local_5f0 = auVar77;
              fVar164 = sqrtf(fVar164);
              auVar72 = ZEXT416(auVar72._0_4_);
              auVar78 = ZEXT416(auVar78._0_4_);
              auVar73 = ZEXT416((uint)local_640._0_4_);
              auVar76 = ZEXT416(auVar76._0_4_);
              uVar69 = extraout_RAX_04;
              auVar71 = local_860._0_16_;
              auVar77 = local_5f0;
              fVar146 = local_600;
              fVar165 = fStack_5fc;
              fVar189 = fStack_5f8;
              fVar167 = fStack_5f4;
            }
            else {
              auVar75 = vsqrtss_avx(auVar75,auVar75);
              fVar164 = auVar75._0_4_;
              fVar165 = fVar146;
              fVar189 = fVar146;
              fVar167 = fVar146;
            }
            auVar235 = ZEXT1664(auVar71);
            auVar240 = ZEXT3264(local_700);
            auVar239 = ZEXT3264(local_720);
            auVar232 = ZEXT3264(local_740);
            auVar222 = ZEXT3264(local_780);
            auVar227 = ZEXT3264(local_7a0);
            auVar236 = ZEXT3264(local_880);
            auVar238 = ZEXT3264(local_8a0);
            auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6e0._0_16_,
                                      local_520._0_16_);
            fVar148 = auVar75._0_4_ * 6.0;
            fVar11 = local_6e0._0_4_ * 6.0;
            auVar179._0_4_ = fVar11 * (float)local_5e0._0_4_;
            auVar179._4_4_ = fVar11 * (float)local_5e0._4_4_;
            auVar179._8_4_ = fVar11 * fStack_5d8;
            auVar179._12_4_ = fVar11 * fStack_5d4;
            auVar155._4_4_ = fVar148;
            auVar155._0_4_ = fVar148;
            auVar155._8_4_ = fVar148;
            auVar155._12_4_ = fVar148;
            auVar75 = vfmadd132ps_fma(auVar155,auVar179,local_5a0._0_16_);
            auVar237 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_520._0_16_,
                                       local_6e0._0_16_);
            fVar148 = auVar237._0_4_ * 6.0;
            auVar180._4_4_ = fVar148;
            auVar180._0_4_ = fVar148;
            auVar180._8_4_ = fVar148;
            auVar180._12_4_ = fVar148;
            auVar75 = vfmadd132ps_fma(auVar180,auVar75,local_5c0._0_16_);
            fVar148 = local_520._0_4_ * 6.0;
            auVar156._4_4_ = fVar148;
            auVar156._0_4_ = fVar148;
            auVar156._8_4_ = fVar148;
            auVar156._12_4_ = fVar148;
            auVar75 = vfmadd132ps_fma(auVar156,auVar75,local_580._0_16_);
            auVar181._0_4_ = auVar75._0_4_ * (float)local_540._0_4_;
            auVar181._4_4_ = auVar75._4_4_ * (float)local_540._0_4_;
            auVar181._8_4_ = auVar75._8_4_ * (float)local_540._0_4_;
            auVar181._12_4_ = auVar75._12_4_ * (float)local_540._0_4_;
            auVar75 = vdpps_avx(auVar71,auVar75,0x7f);
            fVar148 = auVar75._0_4_;
            auVar157._0_4_ = auVar71._0_4_ * fVar148;
            auVar157._4_4_ = auVar71._4_4_ * fVar148;
            auVar157._8_4_ = auVar71._8_4_ * fVar148;
            auVar157._12_4_ = auVar71._12_4_ * fVar148;
            auVar75 = vsubps_avx(auVar181,auVar157);
            fVar148 = (float)local_680._0_4_ * (float)local_560._0_4_;
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar79 = vxorps_avx512vl(auVar71,auVar24);
            auVar201._0_4_ = fVar146 * auVar75._0_4_ * fVar148;
            auVar201._4_4_ = fVar165 * auVar75._4_4_ * fVar148;
            auVar201._8_4_ = fVar189 * auVar75._8_4_ * fVar148;
            auVar201._12_4_ = fVar167 * auVar75._12_4_ * fVar148;
            auVar75 = vdpps_avx(auVar79,local_820,0x7f);
            auVar10 = vmaxss_avx(ZEXT416((uint)fVar163),
                                 ZEXT416((uint)((float)local_840._0_4_ * fVar162 * 1.9073486e-06)));
            auVar237 = vdpps_avx(auVar74,auVar201,0x7f);
            auVar73 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar163),auVar10);
            vfmadd213ss_avx512f(auVar76,ZEXT416((uint)(fVar163 / fVar166)),auVar73);
            auVar73 = vdpps_avx(local_690,local_820,0x7f);
            fVar166 = auVar75._0_4_ + auVar237._0_4_;
            auVar75 = vdpps_avx(auVar74,auVar79,0x7f);
            auVar76 = vmulss_avx512f(auVar72,auVar77);
            auVar72 = vmulss_avx512f(auVar77,auVar77);
            auVar77 = vdpps_avx(auVar74,local_690,0x7f);
            auVar72 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar76._0_4_ * auVar72._0_4_)));
            auVar76 = vfnmadd231ss_fma(auVar75,local_660._0_16_,ZEXT416((uint)fVar166));
            auVar78 = vfnmadd231ss_fma(auVar77,local_660._0_16_,auVar73);
            auVar75 = vpermilps_avx(_local_500,0xff);
            fVar164 = fVar164 - auVar75._0_4_;
            auVar75 = vshufps_avx(auVar71,auVar71,0xff);
            auVar77 = vfmsub213ss_fma(auVar76,auVar72,auVar75);
            fVar146 = auVar78._0_4_ * auVar72._0_4_;
            auVar76 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar77._0_4_)),
                                      ZEXT416((uint)fVar166),ZEXT416((uint)fVar146));
            fVar165 = auVar76._0_4_;
            fVar146 = local_6e0._0_4_ -
                      (local_660._0_4_ * (fVar146 / fVar165) - fVar164 * (auVar73._0_4_ / fVar165));
            uVar147 = 0;
            uVar223 = 0;
            uVar224 = 0;
            fVar166 = (float)local_840._0_4_ -
                      (fVar164 * (fVar166 / fVar165) - local_660._0_4_ * (auVar77._0_4_ / fVar165));
            auVar210 = ZEXT464((uint)fVar166);
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar73 = vandps_avx512vl(local_660._0_16_,auVar25);
            auVar73 = vucomiss_avx512f(auVar73);
            if (!(bool)uVar67 && !(bool)uVar68) {
              auVar73 = vaddss_avx512f(auVar10,auVar73);
              auVar73 = vfmadd231ss_fma(auVar73,local_610,ZEXT416(0x36000000));
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar77 = vandps_avx512vl(ZEXT416((uint)fVar164),auVar26);
              if (auVar77._0_4_ < auVar73._0_4_) {
                bVar66 = uVar63 < 5;
                fVar166 = fVar166 + (float)local_620._0_4_;
                auVar220 = ZEXT3264(local_760);
                auVar216 = ZEXT3264(local_7c0);
                if (fVar166 < fVar234) {
LAB_01a0d692:
                  bVar59 = 0;
                  goto LAB_01a0d69a;
                }
                fVar162 = *(float *)(ray + k * 4 + 0x80);
                if (fVar166 <= fVar162) {
                  bVar59 = 0;
                  if ((fVar146 < 0.0) || (1.0 < fVar146)) goto LAB_01a0d69a;
                  auVar182._4_12_ = SUB1612(ZEXT816(0),0);
                  auVar182._0_4_ = local_6c0._0_4_;
                  auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar182);
                  fVar163 = auVar73._0_4_;
                  pGVar65 = (context->scene->geometries).items[local_7f8].ptr;
                  if ((pGVar65->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_01a0d692;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar59 = 1, pGVar65->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a0d69a;
                  fVar163 = fVar163 * 1.5 +
                            (float)local_6c0._0_4_ * -0.5 * fVar163 * fVar163 * fVar163;
                  local_9c0 = auVar74._0_4_;
                  fStack_9bc = auVar74._4_4_;
                  fStack_9b8 = auVar74._8_4_;
                  fStack_9b4 = auVar74._12_4_;
                  auVar183._0_4_ = fVar163 * local_9c0;
                  auVar183._4_4_ = fVar163 * fStack_9bc;
                  auVar183._8_4_ = fVar163 * fStack_9b8;
                  auVar183._12_4_ = fVar163 * fStack_9b4;
                  auVar77 = vfmadd213ps_fma(auVar75,auVar183,auVar71);
                  auVar73 = vshufps_avx(auVar183,auVar183,0xc9);
                  auVar74 = vshufps_avx(auVar71,auVar71,0xc9);
                  auVar184._0_4_ = auVar183._0_4_ * auVar74._0_4_;
                  auVar184._4_4_ = auVar183._4_4_ * auVar74._4_4_;
                  auVar184._8_4_ = auVar183._8_4_ * auVar74._8_4_;
                  auVar184._12_4_ = auVar183._12_4_ * auVar74._12_4_;
                  auVar75 = vfmsub231ps_fma(auVar184,auVar71,auVar73);
                  auVar73 = vshufps_avx(auVar75,auVar75,0xc9);
                  auVar74 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar75 = vshufps_avx(auVar75,auVar75,0xd2);
                  auVar139._0_4_ = auVar77._0_4_ * auVar75._0_4_;
                  auVar139._4_4_ = auVar77._4_4_ * auVar75._4_4_;
                  auVar139._8_4_ = auVar77._8_4_ * auVar75._8_4_;
                  auVar139._12_4_ = auVar77._12_4_ * auVar75._12_4_;
                  auVar73 = vfmsub231ps_fma(auVar139,auVar73,auVar74);
                  local_4a0 = (RTCHitN  [16])vshufps_avx(auVar73,auVar73,0x55);
                  auStack_490 = vshufps_avx(auVar73,auVar73,0xaa);
                  local_480 = auVar73._0_4_;
                  uStack_47c = local_480;
                  uStack_478 = local_480;
                  uStack_474 = local_480;
                  local_470 = fVar146;
                  fStack_46c = fVar146;
                  fStack_468 = fVar146;
                  fStack_464 = fVar146;
                  local_460 = ZEXT416(0) << 0x20;
                  local_450 = local_4b0._0_8_;
                  uStack_448 = local_4b0._8_8_;
                  local_440 = local_4c0;
                  vpcmpeqd_avx2(ZEXT1632(local_4c0),ZEXT1632(local_4c0));
                  uStack_42c = context->user->instID[0];
                  local_430 = uStack_42c;
                  uStack_428 = uStack_42c;
                  uStack_424 = uStack_42c;
                  uStack_420 = context->user->instPrimID[0];
                  uStack_41c = uStack_420;
                  uStack_418 = uStack_420;
                  uStack_414 = uStack_420;
                  *(float *)(ray + k * 4 + 0x80) = fVar166;
                  local_8c0 = local_4d0;
                  local_7f0.valid = (int *)local_8c0;
                  local_7f0.geometryUserPtr = pGVar65->userPtr;
                  local_7f0.context = context->user;
                  local_7f0.hit = local_4a0;
                  local_7f0.N = 4;
                  local_860._0_4_ = fVar162;
                  local_7f0.ray = (RTCRayN *)ray;
                  if (pGVar65->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar235 = ZEXT1664(auVar71);
                    (*pGVar65->occlusionFilterN)(&local_7f0);
                    auVar238 = ZEXT3264(local_8a0);
                    auVar236 = ZEXT3264(local_880);
                    auVar216 = ZEXT3264(local_7c0);
                    auVar227 = ZEXT3264(local_7a0);
                    auVar222 = ZEXT3264(local_780);
                    auVar220 = ZEXT3264(local_760);
                    auVar232 = ZEXT3264(local_740);
                    auVar239 = ZEXT3264(local_720);
                    auVar240 = ZEXT3264(local_700);
                    fVar162 = (float)local_860._0_4_;
                  }
                  uVar69 = vptestmd_avx512vl(local_8c0,local_8c0);
                  if ((uVar69 & 0xf) != 0) {
                    p_Var2 = context->args->filter;
                    if ((p_Var2 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar65->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar235 = ZEXT1664(auVar235._0_16_);
                      (*p_Var2)(&local_7f0);
                      auVar238 = ZEXT3264(local_8a0);
                      auVar236 = ZEXT3264(local_880);
                      auVar216 = ZEXT3264(local_7c0);
                      auVar227 = ZEXT3264(local_7a0);
                      auVar222 = ZEXT3264(local_780);
                      auVar220 = ZEXT3264(local_760);
                      auVar232 = ZEXT3264(local_740);
                      auVar239 = ZEXT3264(local_720);
                      auVar240 = ZEXT3264(local_700);
                      fVar162 = (float)local_860._0_4_;
                    }
                    uVar69 = vptestmd_avx512vl(local_8c0,local_8c0);
                    uVar69 = uVar69 & 0xf;
                    auVar73 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar3 = (bool)((byte)uVar69 & 1);
                    bVar4 = (bool)((byte)(uVar69 >> 1) & 1);
                    bVar5 = (bool)((byte)(uVar69 >> 2) & 1);
                    bVar6 = SUB81(uVar69 >> 3,0);
                    *(uint *)(local_7f0.ray + 0x80) =
                         (uint)bVar3 * auVar73._0_4_ | (uint)!bVar3 * *(int *)(local_7f0.ray + 0x80)
                    ;
                    *(uint *)(local_7f0.ray + 0x84) =
                         (uint)bVar4 * auVar73._4_4_ | (uint)!bVar4 * *(int *)(local_7f0.ray + 0x84)
                    ;
                    *(uint *)(local_7f0.ray + 0x88) =
                         (uint)bVar5 * auVar73._8_4_ | (uint)!bVar5 * *(int *)(local_7f0.ray + 0x88)
                    ;
                    *(uint *)(local_7f0.ray + 0x8c) =
                         (uint)bVar6 * auVar73._12_4_ |
                         (uint)!bVar6 * *(int *)(local_7f0.ray + 0x8c);
                    bVar59 = 1;
                    if ((byte)uVar69 != 0) goto LAB_01a0d69a;
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar162;
                }
                bVar59 = 0;
                goto LAB_01a0d69a;
              }
            }
            uVar63 = uVar63 + 1;
            auVar220 = ZEXT3264(local_760);
            auVar216 = ZEXT3264(local_7c0);
          }
          bVar66 = false;
LAB_01a0d69a:
          bVar60 = bVar60 | bVar66 & bVar59;
          uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar209._4_4_ = uVar147;
          auVar209._0_4_ = uVar147;
          auVar209._8_4_ = uVar147;
          auVar209._12_4_ = uVar147;
          auVar209._16_4_ = uVar147;
          auVar209._20_4_ = uVar147;
          auVar209._24_4_ = uVar147;
          auVar209._28_4_ = uVar147;
          auVar210 = ZEXT3264(auVar209);
          auVar55._4_4_ = fStack_33c;
          auVar55._0_4_ = local_340;
          auVar55._8_4_ = fStack_338;
          auVar55._12_4_ = fStack_334;
          auVar55._16_4_ = fStack_330;
          auVar55._20_4_ = fStack_32c;
          auVar55._24_4_ = fStack_328;
          auVar55._28_4_ = fStack_324;
          uVar12 = vcmpps_avx512vl(auVar209,auVar55,0xd);
        }
        uVar14 = vpcmpd_avx512vl(local_300,local_2a0,1);
        uVar13 = vpcmpd_avx512vl(local_300,_local_360,1);
        auVar161._0_4_ = (float)local_380._0_4_ + (float)local_1c0._0_4_;
        auVar161._4_4_ = (float)local_380._4_4_ + (float)local_1c0._4_4_;
        auVar161._8_4_ = fStack_378 + fStack_1b8;
        auVar161._12_4_ = fStack_374 + fStack_1b4;
        auVar161._16_4_ = fStack_370 + fStack_1b0;
        auVar161._20_4_ = fStack_36c + fStack_1ac;
        auVar161._24_4_ = fStack_368 + fStack_1a8;
        auVar161._28_4_ = fStack_364 + fStack_1a4;
        uVar147 = auVar210._0_4_;
        auVar188._4_4_ = uVar147;
        auVar188._0_4_ = uVar147;
        auVar188._8_4_ = uVar147;
        auVar188._12_4_ = uVar147;
        auVar188._16_4_ = uVar147;
        auVar188._20_4_ = uVar147;
        auVar188._24_4_ = uVar147;
        auVar188._28_4_ = uVar147;
        uVar12 = vcmpps_avx512vl(auVar161,auVar188,2);
        bVar64 = (byte)local_8ac & (byte)uVar14 & (byte)uVar12;
        auVar195._0_4_ = (float)local_380._0_4_ + (float)local_2e0._0_4_;
        auVar195._4_4_ = (float)local_380._4_4_ + (float)local_2e0._4_4_;
        auVar195._8_4_ = fStack_378 + fStack_2d8;
        auVar195._12_4_ = fStack_374 + fStack_2d4;
        auVar195._16_4_ = fStack_370 + fStack_2d0;
        auVar195._20_4_ = fStack_36c + fStack_2cc;
        auVar195._24_4_ = fStack_368 + fStack_2c8;
        auVar195._28_4_ = fStack_364 + fStack_2c4;
        uVar12 = vcmpps_avx512vl(auVar195,auVar188,2);
        bVar58 = bVar58 & (byte)uVar13 & (byte)uVar12 | bVar64;
        if (bVar58 != 0) {
          abStack_180[uVar61 * 0x60] = bVar58;
          bVar66 = (bool)(bVar64 >> 1 & 1);
          bVar3 = (bool)(bVar64 >> 2 & 1);
          bVar4 = (bool)(bVar64 >> 3 & 1);
          bVar5 = (bool)(bVar64 >> 4 & 1);
          bVar6 = (bool)(bVar64 >> 5 & 1);
          bVar7 = (bool)(bVar64 >> 6 & 1);
          auStack_160[uVar61 * 0x18] =
               (uint)(bVar64 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar64 & 1) * local_2e0._0_4_;
          auStack_160[uVar61 * 0x18 + 1] =
               (uint)bVar66 * local_1c0._4_4_ | (uint)!bVar66 * local_2e0._4_4_;
          auStack_160[uVar61 * 0x18 + 2] =
               (uint)bVar3 * (int)fStack_1b8 | (uint)!bVar3 * (int)fStack_2d8;
          auStack_160[uVar61 * 0x18 + 3] =
               (uint)bVar4 * (int)fStack_1b4 | (uint)!bVar4 * (int)fStack_2d4;
          auStack_160[uVar61 * 0x18 + 4] =
               (uint)bVar5 * (int)fStack_1b0 | (uint)!bVar5 * (int)fStack_2d0;
          auStack_160[uVar61 * 0x18 + 5] =
               (uint)bVar6 * (int)fStack_1ac | (uint)!bVar6 * (int)fStack_2cc;
          auStack_160[uVar61 * 0x18 + 6] =
               (uint)bVar7 * (int)fStack_1a8 | (uint)!bVar7 * (int)fStack_2c8;
          auStack_160[uVar61 * 0x18 + 7] =
               (uint)(bVar64 >> 7) * (int)fStack_1a4 | (uint)!(bool)(bVar64 >> 7) * (int)fStack_2c4;
          uVar69 = vmovlps_avx(local_310);
          (&uStack_140)[uVar61 * 0xc] = uVar69;
          aiStack_138[uVar61 * 0x18] = local_a14 + 1;
          uVar61 = (ulong)((int)uVar61 + 1);
        }
        auVar89 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar242 = ZEXT3264(auVar89);
        auVar210 = ZEXT3264(_DAT_01f7b040);
        prim = local_808;
      }
    }
    do {
      uVar70 = (uint)uVar61;
      uVar61 = (ulong)(uVar70 - 1);
      if (uVar70 == 0) {
        if (bVar60 != 0) goto LAB_01a0dc5e;
        uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar33._4_4_ = uVar147;
        auVar33._0_4_ = uVar147;
        auVar33._8_4_ = uVar147;
        auVar33._12_4_ = uVar147;
        auVar33._16_4_ = uVar147;
        auVar33._20_4_ = uVar147;
        auVar33._24_4_ = uVar147;
        auVar33._28_4_ = uVar147;
        uVar12 = vcmpps_avx512vl(local_280,auVar33,2);
        local_800 = (ulong)((uint)uVar12 & (uint)local_800 - 1 & (uint)local_800);
        goto LAB_01a0b47c;
      }
      auVar89 = *(undefined1 (*) [32])(auStack_160 + uVar61 * 0x18);
      auVar158._0_4_ = auVar89._0_4_ + (float)local_380._0_4_;
      auVar158._4_4_ = auVar89._4_4_ + (float)local_380._4_4_;
      auVar158._8_4_ = auVar89._8_4_ + fStack_378;
      auVar158._12_4_ = auVar89._12_4_ + fStack_374;
      auVar158._16_4_ = auVar89._16_4_ + fStack_370;
      auVar158._20_4_ = auVar89._20_4_ + fStack_36c;
      auVar158._24_4_ = auVar89._24_4_ + fStack_368;
      auVar158._28_4_ = auVar89._28_4_ + fStack_364;
      uVar147 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar32._4_4_ = uVar147;
      auVar32._0_4_ = uVar147;
      auVar32._8_4_ = uVar147;
      auVar32._12_4_ = uVar147;
      auVar32._16_4_ = uVar147;
      auVar32._20_4_ = uVar147;
      auVar32._24_4_ = uVar147;
      auVar32._28_4_ = uVar147;
      uVar12 = vcmpps_avx512vl(auVar158,auVar32,2);
      uVar126 = (uint)uVar12 & (uint)abStack_180[uVar61 * 0x60];
    } while (uVar126 == 0);
    uVar69 = (&uStack_140)[uVar61 * 0xc];
    auVar149._8_8_ = 0;
    auVar149._0_8_ = uVar69;
    auVar187._8_4_ = 0x7f800000;
    auVar187._0_8_ = 0x7f8000007f800000;
    auVar187._12_4_ = 0x7f800000;
    auVar187._16_4_ = 0x7f800000;
    auVar187._20_4_ = 0x7f800000;
    auVar187._24_4_ = 0x7f800000;
    auVar187._28_4_ = 0x7f800000;
    auVar90 = vblendmps_avx512vl(auVar187,auVar89);
    bVar58 = (byte)uVar126;
    auVar121._0_4_ =
         (uint)(bVar58 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar89._0_4_;
    bVar66 = (bool)((byte)(uVar126 >> 1) & 1);
    auVar121._4_4_ = (uint)bVar66 * auVar90._4_4_ | (uint)!bVar66 * (int)auVar89._4_4_;
    bVar66 = (bool)((byte)(uVar126 >> 2) & 1);
    auVar121._8_4_ = (uint)bVar66 * auVar90._8_4_ | (uint)!bVar66 * (int)auVar89._8_4_;
    bVar66 = (bool)((byte)(uVar126 >> 3) & 1);
    auVar121._12_4_ = (uint)bVar66 * auVar90._12_4_ | (uint)!bVar66 * (int)auVar89._12_4_;
    bVar66 = (bool)((byte)(uVar126 >> 4) & 1);
    auVar121._16_4_ = (uint)bVar66 * auVar90._16_4_ | (uint)!bVar66 * (int)auVar89._16_4_;
    bVar66 = (bool)((byte)(uVar126 >> 5) & 1);
    auVar121._20_4_ = (uint)bVar66 * auVar90._20_4_ | (uint)!bVar66 * (int)auVar89._20_4_;
    bVar66 = (bool)((byte)(uVar126 >> 6) & 1);
    auVar121._24_4_ = (uint)bVar66 * auVar90._24_4_ | (uint)!bVar66 * (int)auVar89._24_4_;
    auVar121._28_4_ =
         (uVar126 >> 7) * auVar90._28_4_ | (uint)!SUB41(uVar126 >> 7,0) * (int)auVar89._28_4_;
    auVar89 = vshufps_avx(auVar121,auVar121,0xb1);
    auVar89 = vminps_avx(auVar121,auVar89);
    auVar90 = vshufpd_avx(auVar89,auVar89,5);
    auVar89 = vminps_avx(auVar89,auVar90);
    auVar90 = vpermpd_avx2(auVar89,0x4e);
    auVar89 = vminps_avx(auVar89,auVar90);
    uVar12 = vcmpps_avx512vl(auVar121,auVar89,0);
    bVar64 = (byte)uVar12 & bVar58;
    if (bVar64 != 0) {
      uVar126 = (uint)bVar64;
    }
    uVar127 = 0;
    for (; (uVar126 & 1) == 0; uVar126 = uVar126 >> 1 | 0x80000000) {
      uVar127 = uVar127 + 1;
    }
    local_a14 = aiStack_138[uVar61 * 0x18];
    bVar58 = ~('\x01' << ((byte)uVar127 & 0x1f)) & bVar58;
    abStack_180[uVar61 * 0x60] = bVar58;
    if (bVar58 == 0) {
      uVar70 = uVar70 - 1;
    }
    uVar147 = (undefined4)uVar69;
    auVar140._4_4_ = uVar147;
    auVar140._0_4_ = uVar147;
    auVar140._8_4_ = uVar147;
    auVar140._12_4_ = uVar147;
    auVar140._16_4_ = uVar147;
    auVar140._20_4_ = uVar147;
    auVar140._24_4_ = uVar147;
    auVar140._28_4_ = uVar147;
    auVar73 = vmovshdup_avx(auVar149);
    auVar73 = vsubps_avx(auVar73,auVar149);
    auVar159._0_4_ = auVar73._0_4_;
    auVar159._4_4_ = auVar159._0_4_;
    auVar159._8_4_ = auVar159._0_4_;
    auVar159._12_4_ = auVar159._0_4_;
    auVar159._16_4_ = auVar159._0_4_;
    auVar159._20_4_ = auVar159._0_4_;
    auVar159._24_4_ = auVar159._0_4_;
    auVar159._28_4_ = auVar159._0_4_;
    auVar73 = vfmadd132ps_fma(auVar159,auVar140,auVar210._0_32_);
    _local_4a0 = ZEXT1632(auVar73);
    local_310._8_8_ = 0;
    local_310._0_8_ = *(ulong *)(local_4a0 + (ulong)uVar127 * 4);
    uVar61 = (ulong)uVar70;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }